

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O3

void duckdb_brotli::BrotliSplitBlock
               (MemoryManager *m,Command *cmds,size_t num_commands,uint8_t *data,size_t pos,
               size_t mask,BrotliEncoderParams *params,BlockSplit *literal_split,
               BlockSplit *insert_and_copy_split,BlockSplit *dist_split)

{
  int *piVar1;
  long *plVar2;
  uint uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ushort uVar15;
  Command *pCVar16;
  uint8_t *puVar17;
  uint32_t *puVar18;
  HistogramLiteral *tmp;
  HistogramLiteral *pHVar19;
  void *pvVar20;
  uint16_t *puVar21;
  HistogramCommand *tmp_00;
  uint32_t *puVar22;
  void *pvVar23;
  ulong uVar24;
  ushort *puVar25;
  void *pvVar26;
  void *pvVar27;
  void *pvVar28;
  HistogramDistance *tmp_01;
  HistogramDistance *pHVar29;
  uint32_t *puVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  byte *pbVar34;
  ulong uVar35;
  uint *puVar36;
  long lVar37;
  uint32_t uVar38;
  size_t sVar39;
  size_t sVar40;
  ulong uVar41;
  byte bVar42;
  uint uVar43;
  uint uVar44;
  byte bVar45;
  ulong uVar46;
  HistogramPair *pHVar47;
  size_t __n;
  long lVar48;
  HistogramCommand *pHVar49;
  void *pvVar50;
  size_t __n_00;
  size_t sVar51;
  uint *puVar52;
  long lVar53;
  void *pvVar54;
  ulong uVar55;
  long lVar56;
  int iVar63;
  double dVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar64;
  undefined1 auVar62 [16];
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  double dVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  int iVar118;
  int iVar119;
  int iVar126;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  int iVar127;
  undefined1 auVar125 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  ulong local_118;
  void *local_110;
  HistogramCommand *local_108;
  HistogramCommand *local_f8;
  void *local_e8;
  void *local_e0;
  ulong local_d8;
  uint32_t *local_d0;
  void *local_c8;
  void *local_c0;
  HistogramPair *local_b8;
  HistogramDistance *local_b0;
  long local_a8;
  HistogramPair *local_a0;
  uint32_t *local_98;
  HistogramLiteral *local_90;
  HistogramPair *local_80;
  HistogramCommand *local_68;
  uint32_t *local_60;
  uint32_t *local_58;
  
  if (num_commands == 0) {
    local_e0 = (void *)0x0;
LAB_01d4469f:
    literal_split->num_types = 1;
  }
  else {
    pCVar16 = cmds;
    sVar39 = num_commands;
    sVar40 = 0;
    do {
      sVar51 = sVar40;
      uVar35 = (ulong)pCVar16->insert_len_;
      sVar40 = sVar51 + uVar35;
      pCVar16 = pCVar16 + 1;
      sVar39 = sVar39 - 1;
    } while (sVar39 != 0);
    if (sVar40 == 0) {
      local_e0 = (void *)0x0;
    }
    else {
      local_e0 = BrotliAllocate(m,sVar40);
    }
    puVar18 = &cmds->copy_len_;
    lVar53 = 0;
    sVar39 = num_commands;
    do {
      uVar55 = pos & mask;
      __n = (size_t)((Command *)(puVar18 + -1))->insert_len_;
      if (mask < uVar55 + __n) {
        __n_00 = (mask + 1) - uVar55;
        switchD_012bc561::default((void *)((long)local_e0 + lVar53),data + uVar55,__n_00);
        lVar53 = lVar53 + __n_00;
        __n = __n - __n_00;
        uVar55 = 0;
      }
      if (__n != 0) {
        switchD_012bc561::default((void *)((long)local_e0 + lVar53),data + uVar55,__n);
        lVar53 = lVar53 + __n;
      }
      pos = (ulong)(*puVar18 & 0x1ffffff) + __n + uVar55;
      puVar18 = puVar18 + 4;
      sVar39 = sVar39 - 1;
    } while (sVar39 != 0);
    uVar55 = 100;
    if (sVar40 < 0xd480) {
      uVar55 = (ulong)(((uint)sVar40 & 0xffff) / 0x220 + 1);
    }
    if (sVar40 == 0) goto LAB_01d4469f;
    if (sVar40 < 0x80) {
      sVar39 = literal_split->num_blocks;
      uVar55 = literal_split->types_alloc_size;
      uVar35 = sVar39 + 1;
      if (uVar55 < uVar35) {
        if (uVar55 == 0) {
          uVar55 = uVar35;
        }
        do {
          uVar41 = uVar55;
          uVar55 = uVar41 * 2;
        } while (uVar41 < uVar35);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar41);
        if (literal_split->types_alloc_size != 0) {
          switchD_012bc561::default(puVar17,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar17;
        literal_split->types_alloc_size = uVar41;
        sVar39 = literal_split->num_blocks;
        uVar35 = sVar39 + 1;
      }
      uVar55 = literal_split->lengths_alloc_size;
      if (uVar55 < uVar35) {
        if (uVar55 == 0) {
          uVar55 = uVar35;
        }
        do {
          uVar41 = uVar55;
          uVar55 = uVar41 * 2;
        } while (uVar41 < uVar35);
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          switchD_012bc561::default
                    (puVar18,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar18;
        literal_split->lengths_alloc_size = uVar41;
        sVar39 = literal_split->num_blocks;
      }
      literal_split->num_types = 1;
      literal_split->types[sVar39] = '\0';
      sVar39 = literal_split->num_blocks;
      literal_split->lengths[sVar39] = (uint)sVar40;
      literal_split->num_blocks = sVar39 + 1;
    }
    else {
      lVar56 = uVar55 * 0x410;
      pvVar20 = BrotliAllocate(m,lVar56 + 0x410);
      lVar53 = 0;
      do {
        switchD_012e5a64::default((void *)(lVar53 + (long)pvVar20),0,0x408);
        *(undefined8 *)((long)pvVar20 + lVar53 + 0x408) = 0x7ff0000000000000;
        lVar53 = lVar53 + 0x410;
      } while (lVar56 - lVar53 != 0);
      uVar46 = 0;
      uVar41 = 7;
      do {
        uVar24 = (uVar46 * sVar40) / uVar55;
        if (uVar46 != 0) {
          uVar41 = (ulong)(uint)((int)uVar41 * 0x41a7);
          uVar24 = uVar24 + uVar41 % (sVar40 / uVar55);
        }
        if (sVar40 <= uVar24 + 0x46) {
          uVar24 = sVar40 - 0x47;
        }
        plVar2 = (long *)((long)pvVar20 + uVar46 * 0x410 + 0x400);
        *plVar2 = *plVar2 + 0x46;
        lVar53 = -0x46;
        do {
          piVar1 = (int *)((long)pvVar20 +
                          (ulong)*(byte *)((long)local_e0 + lVar53 + uVar24 + 0x46) * 4 +
                          uVar46 * 0x410);
          *piVar1 = *piVar1 + 1;
          lVar53 = lVar53 + 1;
        } while (lVar53 != 0);
        uVar46 = uVar46 + 1;
      } while (uVar46 != uVar55);
      uVar41 = (sVar40 * 2) / 0x46 + uVar55 + 99;
      if (uVar41 != uVar41 % uVar55) {
        pvVar23 = (void *)(lVar56 + (long)pvVar20);
        uVar46 = 7;
        uVar24 = 0;
        do {
          switchD_012e5a64::default(pvVar23,0,0x400);
          *(undefined8 *)((long)pvVar23 + 0x408) = 0x7ff0000000000000;
          uVar46 = (ulong)(uint)((int)uVar46 * 0x41a7);
          pbVar34 = (byte *)(uVar46 % (sVar40 - 0x45) + (long)local_e0);
          *(undefined8 *)((long)pvVar23 + 0x400) = 0x46;
          lVar53 = -0x46;
          do {
            bVar42 = *pbVar34;
            pbVar34 = pbVar34 + 1;
            piVar1 = (int *)((long)pvVar23 + (ulong)bVar42 * 4);
            *piVar1 = *piVar1 + 1;
            lVar53 = lVar53 + 1;
          } while (lVar53 != 0);
          lVar53 = (uVar24 % uVar55) * 0x410;
          plVar2 = (long *)((long)pvVar20 + lVar53 + 0x400);
          *plVar2 = *plVar2 + 0x46;
          lVar56 = 0;
          do {
            piVar1 = (int *)((long)pvVar20 + lVar56 * 4 + lVar53);
            *piVar1 = *piVar1 + *(int *)((long)pvVar23 + lVar56 * 4);
            lVar56 = lVar56 + 1;
          } while (lVar56 != 0x100);
          uVar24 = uVar24 + 1;
        } while (uVar24 < uVar41 - uVar41 % uVar55);
      }
      pvVar23 = BrotliAllocate(m,sVar40);
      iVar119 = (int)uVar55;
      pvVar54 = BrotliAllocate(m,(ulong)(uint)(iVar119 << 0xb));
      pvVar26 = BrotliAllocate(m,(ulong)(uint)(iVar119 * 8));
      sVar39 = (iVar119 + 7U >> 3) * sVar40;
      if (sVar39 == 0) {
        local_c0 = (void *)0x0;
      }
      else {
        local_c0 = BrotliAllocate(m,sVar39);
      }
      pvVar27 = BrotliAllocate(m,(ulong)(uint)(iVar119 * 2));
      lVar53 = 3;
      if (10 < params->quality) {
        lVar53 = 10;
      }
      lVar56 = sVar51 + uVar35;
      lVar37 = 0;
      do {
        uVar41 = uVar55 + 7 >> 3;
        if (uVar55 < 2) {
          switchD_012e5a64::default(pvVar23,0,sVar40);
          uVar46 = 1;
          auVar137 = _DAT_01d9fb10;
        }
        else {
          switchD_012e5a64::default(pvVar54,0,uVar55 << 0xb);
          uVar46 = 0;
          puVar36 = (uint *)((long)pvVar20 + 0x400);
          do {
            uVar24 = (ulong)*puVar36;
            if (uVar24 < 0x100) {
              dVar57 = (double)(&kBrotliLog2Table)[uVar24];
            }
            else {
              dVar57 = log2((double)uVar24);
            }
            *(double *)((long)pvVar54 + uVar46 * 8) = dVar57;
            uVar46 = uVar46 + 1;
            puVar36 = puVar36 + 0x104;
          } while (uVar55 != uVar46);
          pvVar28 = (void *)(uVar55 * 0x7f8 + (long)pvVar54);
          lVar48 = 0x100;
          puVar36 = (uint *)((long)pvVar20 + 0x3fc);
          do {
            lVar48 = lVar48 + -1;
            uVar46 = 0;
            puVar52 = puVar36;
            do {
              dVar65 = -2.0;
              dVar57 = *(double *)((long)pvVar54 + uVar46 * 8);
              uVar24 = (ulong)*puVar52;
              if (uVar24 != 0) {
                if (*puVar52 < 0x100) {
                  dVar65 = (double)(&kBrotliLog2Table)[uVar24];
                }
                else {
                  dVar65 = log2((double)uVar24);
                }
              }
              *(double *)((long)pvVar28 + uVar46 * 8) = dVar57 - dVar65;
              uVar46 = uVar46 + 1;
              puVar52 = puVar52 + 0x104;
            } while (uVar55 != uVar46);
            pvVar28 = (void *)((long)pvVar28 + uVar55 * -8);
            puVar36 = puVar36 + -1;
          } while (lVar48 != 0);
          switchD_012e5a64::default(pvVar26,0,uVar55 * 8);
          switchD_012e5a64::default(local_c0,0,uVar41 * sVar40);
          auVar137 = _DAT_01d9fb10;
          uVar46 = 0;
          do {
            bVar42 = *(byte *)((long)local_e0 + uVar46);
            uVar24 = 0;
            dVar57 = 1e+99;
            do {
              dVar65 = *(double *)((long)pvVar54 + uVar24 * 8 + bVar42 * uVar55 * 8) +
                       *(double *)((long)pvVar26 + uVar24 * 8);
              *(double *)((long)pvVar26 + uVar24 * 8) = dVar65;
              if (dVar65 < dVar57) {
                *(char *)((long)pvVar23 + uVar46) = (char)uVar24;
                dVar57 = dVar65;
              }
              uVar24 = uVar24 + 1;
            } while (uVar55 != uVar24);
            dVar65 = 28.1;
            if (uVar46 < 2000) {
              dVar65 = (((double)(long)uVar46 * 0.07) / 2000.0 + 0.77) * 28.1;
            }
            uVar24 = 0;
            do {
              dVar71 = *(double *)((long)pvVar26 + uVar24 * 8) - dVar57;
              *(double *)((long)pvVar26 + uVar24 * 8) = dVar71;
              if (dVar65 <= dVar71) {
                *(double *)((long)pvVar26 + uVar24 * 8) = dVar65;
                pbVar34 = (byte *)((long)local_c0 + (uVar24 >> 3) + uVar46 * uVar41);
                *pbVar34 = *pbVar34 | '\x01' << ((byte)uVar24 & 7);
              }
              uVar24 = uVar24 + 1;
            } while (uVar55 != uVar24);
            uVar46 = uVar46 + 1;
          } while (uVar46 != sVar40);
          bVar42 = *(byte *)((long)pvVar23 + (sVar40 - 1));
          pvVar28 = (void *)((sVar51 + uVar35 + -2) * uVar41 + (long)local_c0);
          uVar46 = 1;
          lVar48 = lVar56;
          do {
            if ((*(byte *)((long)pvVar28 + (ulong)(bVar42 >> 3)) >> (bVar42 & 7) & 1) != 0) {
              bVar45 = *(byte *)((long)pvVar23 + lVar48 + -2);
              uVar46 = uVar46 + (bVar42 != bVar45);
              bVar42 = bVar45;
            }
            *(byte *)((long)pvVar23 + lVar48 + -2) = bVar42;
            pvVar28 = (void *)((long)pvVar28 - uVar41);
            lVar48 = lVar48 + -1;
          } while (lVar48 != 1);
        }
        if (uVar55 != 0) {
          lVar48 = uVar55 - 1;
          auVar99._8_4_ = (int)lVar48;
          auVar99._0_8_ = lVar48;
          auVar99._12_4_ = (int)((ulong)lVar48 >> 0x20);
          auVar99 = auVar99 ^ auVar137;
          lVar48 = 0;
          auVar94 = _DAT_01d9fb00;
          auVar132 = _DAT_01da0bd0;
          auVar136 = _DAT_01da0bc0;
          auVar98 = _DAT_01da0bb0;
          do {
            auVar115 = auVar94 ^ auVar137;
            iVar119 = auVar99._0_4_;
            iVar118 = -(uint)(iVar119 < auVar115._0_4_);
            iVar63 = auVar99._4_4_;
            auVar78._4_4_ = -(uint)(iVar63 < auVar115._4_4_);
            iVar127 = auVar99._8_4_;
            iVar126 = -(uint)(iVar127 < auVar115._8_4_);
            iVar64 = auVar99._12_4_;
            auVar78._12_4_ = -(uint)(iVar64 < auVar115._12_4_);
            auVar106._4_4_ = iVar118;
            auVar106._0_4_ = iVar118;
            auVar106._8_4_ = iVar126;
            auVar106._12_4_ = iVar126;
            auVar128 = pshuflw(in_XMM8,auVar106,0xe8);
            auVar80._4_4_ = -(uint)(auVar115._4_4_ == iVar63);
            auVar80._12_4_ = -(uint)(auVar115._12_4_ == iVar64);
            auVar80._0_4_ = auVar80._4_4_;
            auVar80._8_4_ = auVar80._12_4_;
            auVar135 = pshuflw(in_XMM9,auVar80,0xe8);
            auVar78._0_4_ = auVar78._4_4_;
            auVar78._8_4_ = auVar78._12_4_;
            auVar129 = pshuflw(auVar128,auVar78,0xe8);
            auVar115._8_4_ = 0xffffffff;
            auVar115._0_8_ = 0xffffffffffffffff;
            auVar115._12_4_ = 0xffffffff;
            auVar115 = (auVar129 | auVar135 & auVar128) ^ auVar115;
            auVar115 = packssdw(auVar115,auVar115);
            if ((auVar115 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar27 + lVar48) = 0x100;
            }
            auVar78 = auVar80 & auVar106 | auVar78;
            auVar115 = packssdw(auVar78,auVar78);
            auVar129._8_4_ = 0xffffffff;
            auVar129._0_8_ = 0xffffffffffffffff;
            auVar129._12_4_ = 0xffffffff;
            auVar115 = packssdw(auVar115 ^ auVar129,auVar115 ^ auVar129);
            if ((auVar115._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar27 + lVar48 + 2) = 0x100;
            }
            auVar115 = auVar132 ^ auVar137;
            iVar118 = -(uint)(iVar119 < auVar115._0_4_);
            auVar120._4_4_ = -(uint)(iVar63 < auVar115._4_4_);
            iVar126 = -(uint)(iVar127 < auVar115._8_4_);
            auVar120._12_4_ = -(uint)(iVar64 < auVar115._12_4_);
            auVar79._4_4_ = iVar118;
            auVar79._0_4_ = iVar118;
            auVar79._8_4_ = iVar126;
            auVar79._12_4_ = iVar126;
            auVar105._4_4_ = -(uint)(auVar115._4_4_ == iVar63);
            auVar105._12_4_ = -(uint)(auVar115._12_4_ == iVar64);
            auVar105._0_4_ = auVar105._4_4_;
            auVar105._8_4_ = auVar105._12_4_;
            auVar120._0_4_ = auVar120._4_4_;
            auVar120._8_4_ = auVar120._12_4_;
            auVar115 = auVar105 & auVar79 | auVar120;
            auVar115 = packssdw(auVar115,auVar115);
            auVar13._8_4_ = 0xffffffff;
            auVar13._0_8_ = 0xffffffffffffffff;
            auVar13._12_4_ = 0xffffffff;
            auVar115 = packssdw(auVar115 ^ auVar13,auVar115 ^ auVar13);
            if ((auVar115 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar27 + lVar48 + 4) = 0x100;
            }
            auVar80 = pshufhw(auVar79,auVar79,0x84);
            auVar106 = pshufhw(auVar105,auVar105,0x84);
            auVar78 = pshufhw(auVar80,auVar120,0x84);
            auVar81._8_4_ = 0xffffffff;
            auVar81._0_8_ = 0xffffffffffffffff;
            auVar81._12_4_ = 0xffffffff;
            auVar81 = (auVar78 | auVar106 & auVar80) ^ auVar81;
            auVar80 = packssdw(auVar81,auVar81);
            if ((auVar80 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar27 + lVar48 + 6) = 0x100;
            }
            auVar80 = auVar136 ^ auVar137;
            iVar118 = -(uint)(iVar119 < auVar80._0_4_);
            auVar83._4_4_ = -(uint)(iVar63 < auVar80._4_4_);
            iVar126 = -(uint)(iVar127 < auVar80._8_4_);
            auVar83._12_4_ = -(uint)(iVar64 < auVar80._12_4_);
            auVar107._4_4_ = iVar118;
            auVar107._0_4_ = iVar118;
            auVar107._8_4_ = iVar126;
            auVar107._12_4_ = iVar126;
            auVar115 = pshuflw(auVar115,auVar107,0xe8);
            auVar82._4_4_ = -(uint)(auVar80._4_4_ == iVar63);
            auVar82._12_4_ = -(uint)(auVar80._12_4_ == iVar64);
            auVar82._0_4_ = auVar82._4_4_;
            auVar82._8_4_ = auVar82._12_4_;
            in_XMM9 = pshuflw(auVar135 & auVar128,auVar82,0xe8);
            in_XMM9 = in_XMM9 & auVar115;
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            auVar115 = pshuflw(auVar115,auVar83,0xe8);
            auVar128._8_4_ = 0xffffffff;
            auVar128._0_8_ = 0xffffffffffffffff;
            auVar128._12_4_ = 0xffffffff;
            auVar128 = (auVar115 | in_XMM9) ^ auVar128;
            auVar115 = packssdw(auVar128,auVar128);
            if ((auVar115 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar27 + lVar48 + 8) = 0x100;
            }
            auVar83 = auVar82 & auVar107 | auVar83;
            auVar115 = packssdw(auVar83,auVar83);
            auVar135._8_4_ = 0xffffffff;
            auVar135._0_8_ = 0xffffffffffffffff;
            auVar135._12_4_ = 0xffffffff;
            auVar115 = packssdw(auVar115 ^ auVar135,auVar115 ^ auVar135);
            if ((auVar115 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar27 + lVar48 + 10) = 0x100;
            }
            auVar115 = auVar98 ^ auVar137;
            iVar119 = -(uint)(iVar119 < auVar115._0_4_);
            auVar121._4_4_ = -(uint)(iVar63 < auVar115._4_4_);
            iVar127 = -(uint)(iVar127 < auVar115._8_4_);
            auVar121._12_4_ = -(uint)(iVar64 < auVar115._12_4_);
            auVar84._4_4_ = iVar119;
            auVar84._0_4_ = iVar119;
            auVar84._8_4_ = iVar127;
            auVar84._12_4_ = iVar127;
            auVar108._4_4_ = -(uint)(auVar115._4_4_ == iVar63);
            auVar108._12_4_ = -(uint)(auVar115._12_4_ == iVar64);
            auVar108._0_4_ = auVar108._4_4_;
            auVar108._8_4_ = auVar108._12_4_;
            auVar121._0_4_ = auVar121._4_4_;
            auVar121._8_4_ = auVar121._12_4_;
            auVar115 = auVar108 & auVar84 | auVar121;
            auVar115 = packssdw(auVar115,auVar115);
            auVar14._8_4_ = 0xffffffff;
            auVar14._0_8_ = 0xffffffffffffffff;
            auVar14._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar115 ^ auVar14,auVar115 ^ auVar14);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar27 + lVar48 + 0xc) = 0x100;
            }
            auVar115 = pshufhw(auVar84,auVar84,0x84);
            auVar78 = pshufhw(auVar108,auVar108,0x84);
            auVar80 = pshufhw(auVar115,auVar121,0x84);
            auVar85._8_4_ = 0xffffffff;
            auVar85._0_8_ = 0xffffffffffffffff;
            auVar85._12_4_ = 0xffffffff;
            auVar85 = (auVar80 | auVar78 & auVar115) ^ auVar85;
            auVar115 = packssdw(auVar85,auVar85);
            if ((auVar115 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar27 + lVar48 + 0xe) = 0x100;
            }
            lVar31 = auVar94._8_8_;
            auVar94._0_8_ = auVar94._0_8_ + 8;
            auVar94._8_8_ = lVar31 + 8;
            lVar31 = auVar132._8_8_;
            auVar132._0_8_ = auVar132._0_8_ + 8;
            auVar132._8_8_ = lVar31 + 8;
            lVar31 = auVar136._8_8_;
            auVar136._0_8_ = auVar136._0_8_ + 8;
            auVar136._8_8_ = lVar31 + 8;
            lVar31 = auVar98._8_8_;
            auVar98._0_8_ = auVar98._0_8_ + 8;
            auVar98._8_8_ = lVar31 + 8;
            lVar48 = lVar48 + 0x10;
          } while (uVar41 * 0x10 != lVar48);
        }
        lVar48 = 0;
        uVar15 = 0;
        do {
          if (*(short *)((long)pvVar27 + (ulong)*(byte *)((long)pvVar23 + lVar48) * 2) == 0x100) {
            *(ushort *)((long)pvVar27 + (ulong)*(byte *)((long)pvVar23 + lVar48) * 2) = uVar15;
            uVar15 = uVar15 + 1;
          }
          lVar48 = lVar48 + 1;
        } while (lVar56 != lVar48);
        lVar48 = 0;
        do {
          *(undefined1 *)((long)pvVar23 + lVar48) =
               *(undefined1 *)((long)pvVar27 + (ulong)*(byte *)((long)pvVar23 + lVar48) * 2);
          lVar48 = lVar48 + 1;
        } while (lVar56 != lVar48);
        uVar55 = (ulong)uVar15;
        if (uVar15 != 0) {
          lVar48 = 0;
          do {
            switchD_012e5a64::default((void *)(lVar48 + (long)pvVar20),0,0x408);
            *(undefined8 *)((long)pvVar20 + lVar48 + 0x408) = 0x7ff0000000000000;
            lVar48 = lVar48 + 0x410;
          } while (uVar55 * 0x410 != lVar48);
        }
        lVar48 = 0;
        do {
          lVar31 = (ulong)*(byte *)((long)pvVar23 + lVar48) * 0x410;
          piVar1 = (int *)((long)pvVar20 + (ulong)*(byte *)((long)local_e0 + lVar48) * 4 + lVar31);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar20 + lVar31 + 0x400);
          *plVar2 = *plVar2 + 1;
          lVar48 = lVar48 + 1;
        } while (lVar56 != lVar48);
        lVar37 = lVar37 + 1;
      } while (lVar37 != lVar53);
      BrotliFree(m,pvVar54);
      BrotliFree(m,pvVar26);
      BrotliFree(m,local_c0);
      BrotliFree(m,pvVar27);
      BrotliFree(m,pvVar20);
      if (uVar46 == 0) {
        lVar53 = 0x100;
        local_60 = (uint32_t *)0x0;
LAB_01d45107:
        local_d0 = (uint32_t *)BrotliAllocate(m,lVar53 * 4);
        uVar55 = uVar46 * 0x10 + 0x3f0;
        local_118 = uVar55 >> 6;
        if (0x3f < uVar55) goto LAB_01d45153;
        local_90 = (HistogramLiteral *)0x0;
        local_98 = (uint32_t *)0x0;
      }
      else {
        local_60 = (uint32_t *)BrotliAllocate(m,uVar46 * 4);
        lVar53 = uVar46 + 0x100;
        if (lVar53 != 0) goto LAB_01d45107;
        local_118 = 0x3ffffffffffffcf;
        lVar53 = 0;
        local_d0 = (uint32_t *)0x0;
LAB_01d45153:
        local_90 = (HistogramLiteral *)BrotliAllocate(m,local_118 * 0x410);
        local_98 = (uint32_t *)BrotliAllocate(m,local_118 * 4);
      }
      if (uVar46 == 0) {
        local_108 = (HistogramCommand *)0x0;
      }
      else {
        uVar55 = 0x40;
        if (uVar46 < 0x40) {
          uVar55 = uVar46;
        }
        local_108 = (HistogramCommand *)BrotliAllocate(m,uVar55 * 0x410);
      }
      local_a0 = (HistogramPair *)BrotliAllocate(m,0xc018);
      tmp = (HistogramLiteral *)BrotliAllocate(m,0x820);
      lVar56 = 0;
      switchD_012e5a64::default(local_d0,0,lVar53 << 2);
      lVar53 = 0;
      do {
        local_d0[lVar56 + 0x100] = local_d0[lVar56 + 0x100] + 1;
        if ((sVar51 + uVar35 + -1 == lVar53) ||
           (*(char *)((long)pvVar23 + lVar53) != *(char *)((long)pvVar23 + lVar53 + 1))) {
          lVar56 = lVar56 + 1;
        }
        lVar53 = lVar53 + 1;
      } while (sVar51 + uVar35 != lVar53);
      if (uVar46 == 0) {
        local_c8 = (void *)0x0;
      }
      else {
        local_b0 = (HistogramDistance *)0x0;
        local_68 = (HistogramCommand *)0x0;
        local_c8 = (void *)0x0;
        local_f8 = (HistogramCommand *)0x0;
        uVar41 = 0;
        uVar35 = uVar46;
        puVar18 = local_60;
        uVar55 = local_118;
        do {
          uVar24 = 0x40;
          if (uVar35 < 0x40) {
            uVar24 = uVar35;
          }
          lVar53 = uVar24 + (uVar24 == 0);
          lVar56 = 0;
          do {
            uVar43 = local_d0[uVar41 + lVar56 + 0x100];
            pHVar19 = (HistogramLiteral *)((long)local_108 + lVar56 * 0x410);
            switchD_012e5a64::default(pHVar19,0,0x408);
            ((HistogramLiteral *)((long)local_108 + lVar56 * 0x410))->bit_cost_ = INFINITY;
            if ((ulong)uVar43 != 0) {
              sVar39 = 0;
              do {
                pHVar19->data_[*(byte *)((long)local_e0 + sVar39 + (long)local_f8)] =
                     pHVar19->data_[*(byte *)((long)local_e0 + sVar39 + (long)local_f8)] + 1;
                sVar39 = sVar39 + 1;
                pHVar19->total_count_ = sVar39;
              } while (uVar43 != sVar39);
              local_f8 = (HistogramCommand *)((long)local_f8 + sVar39);
            }
            dVar57 = BrotliPopulationCostLiteral(pHVar19);
            pHVar19->bit_cost_ = dVar57;
            local_d0[lVar56 + 0x40] = (uint32_t)lVar56;
            local_d0[lVar56 + 0x80] = (uint32_t)lVar56;
            local_d0[lVar56] = 1;
            lVar56 = lVar56 + 1;
          } while (lVar56 != lVar53);
          sVar39 = uVar46 - uVar41;
          if (0x3f < sVar39) {
            sVar39 = 0x40;
          }
          sVar39 = BrotliHistogramCombineLiteral
                             ((HistogramLiteral *)local_108,tmp,local_d0,local_d0 + 0x80,
                              local_d0 + 0x40,local_a0,sVar39,sVar39,0x40,0x800);
          uVar24 = (long)local_b0 + sVar39;
          if (local_118 < uVar24) {
            uVar33 = local_118;
            if (local_118 == 0) {
              uVar33 = uVar24;
            }
            do {
              uVar32 = uVar33;
              uVar33 = uVar32 * 2;
            } while (uVar32 < uVar24);
            pHVar19 = (HistogramLiteral *)BrotliAllocate(m,uVar32 * 0x410);
            if (local_118 != 0) {
              switchD_012bc561::default(pHVar19,local_90,local_118 * 0x410);
            }
            BrotliFree(m,local_90);
            local_118 = uVar32;
            local_90 = pHVar19;
          }
          uVar24 = (long)local_68 + sVar39;
          if (uVar55 < uVar24) {
            uVar33 = uVar55;
            if (uVar55 == 0) {
              uVar33 = uVar24;
            }
            do {
              uVar32 = uVar33;
              uVar33 = uVar32 * 2;
            } while (uVar32 < uVar24);
            puVar30 = (uint32_t *)BrotliAllocate(m,uVar32 * 4);
            if (uVar55 != 0) {
              switchD_012bc561::default(puVar30,local_98,uVar55 << 2);
            }
            BrotliFree(m,local_98);
            uVar55 = uVar32;
            local_98 = puVar30;
          }
          if (sVar39 != 0) {
            pHVar19 = local_90 + (long)local_b0;
            sVar40 = 0;
            do {
              switchD_012bc561::default
                        (pHVar19,(HistogramLiteral *)
                                 ((long)local_108 + (ulong)local_d0[sVar40 + 0x40] * 0x410),0x410);
              local_98[(long)local_68 + sVar40] = local_d0[local_d0[sVar40 + 0x40]];
              local_d0[(ulong)local_d0[sVar40 + 0x40] + 0xc0] = (uint32_t)sVar40;
              sVar40 = sVar40 + 1;
              pHVar19 = pHVar19 + 1;
            } while (sVar39 != sVar40);
            local_b0 = (HistogramDistance *)((long)local_b0 + sVar40);
            local_68 = (HistogramCommand *)((long)local_68 + sVar40);
          }
          lVar56 = 0;
          do {
            puVar18[lVar56] = local_d0[(ulong)local_d0[lVar56 + 0x80] + 0xc0] + (int)local_c8;
            lVar56 = lVar56 + 1;
          } while (lVar53 != lVar56);
          local_c8 = (void *)((long)local_c8 + sVar39);
          uVar41 = uVar41 + 0x40;
          uVar35 = uVar35 - 0x40;
          puVar18 = puVar18 + 0x40;
        } while (uVar41 < uVar46);
      }
      BrotliFree(m,local_108);
      uVar35 = ((ulong)local_c8 >> 1) * (long)local_c8;
      if ((ulong)((long)local_c8 << 6) < uVar35) {
        uVar35 = (long)local_c8 << 6;
      }
      if (0x800 < uVar35) {
        BrotliFree(m,local_a0);
        local_a0 = (HistogramPair *)BrotliAllocate(m,uVar35 * 0x18 + 0x18);
      }
      if (local_c8 == (void *)0x0) {
        puVar18 = (uint32_t *)0x0;
      }
      else {
        puVar18 = (uint32_t *)BrotliAllocate(m,(long)local_c8 * 4);
        auVar94 = _DAT_01da0ae0;
        auVar137 = _DAT_01d9fb10;
        lVar53 = (long)local_c8 - 1;
        auVar58._8_4_ = (int)lVar53;
        auVar58._0_8_ = lVar53;
        auVar58._12_4_ = (int)((ulong)lVar53 >> 0x20);
        uVar55 = 0;
        auVar58 = auVar58 ^ _DAT_01d9fb10;
        auVar66 = _DAT_01d9fb00;
        do {
          bVar4 = auVar58._0_4_ < SUB164(auVar66 ^ auVar137,0);
          iVar119 = auVar58._4_4_;
          iVar63 = SUB164(auVar66 ^ auVar137,4);
          if ((bool)(~(iVar119 < iVar63 || iVar63 == iVar119 && bVar4) & 1)) {
            puVar18[uVar55] = (uint32_t)uVar55;
          }
          if (iVar119 >= iVar63 && (iVar63 != iVar119 || !bVar4)) {
            puVar18[uVar55 + 1] = (uint32_t)uVar55 + 1;
          }
          uVar55 = uVar55 + 2;
          lVar53 = auVar66._8_8_;
          auVar66._0_8_ = auVar66._0_8_ + auVar94._0_8_;
          auVar66._8_8_ = lVar53 + auVar94._8_8_;
        } while (((long)local_c8 + 1U & 0xfffffffffffffffe) != uVar55);
      }
      sVar39 = BrotliHistogramCombineLiteral
                         (local_90,tmp,local_98,local_60,puVar18,local_a0,(size_t)local_c8,uVar46,
                          0x100,uVar35);
      BrotliFree(m,local_a0);
      BrotliFree(m,local_98);
      if (local_c8 == (void *)0x0) {
        local_108 = (HistogramCommand *)0x0;
      }
      else {
        local_108 = (HistogramCommand *)BrotliAllocate(m,(long)local_c8 << 2);
        switchD_012e5a64::default(local_108,0xff,(long)local_c8 << 2);
      }
      if (uVar46 != 0) {
        iVar119 = 0;
        lVar53 = 0;
        uVar35 = 0;
        do {
          switchD_012e5a64::default(tmp,0,0x408);
          tmp->bit_cost_ = INFINITY;
          if (local_d0[uVar35 + 0x100] != 0) {
            uVar55 = 0;
            do {
              tmp->data_[*(byte *)((long)local_e0 + uVar55 + lVar53)] =
                   tmp->data_[*(byte *)((long)local_e0 + uVar55 + lVar53)] + 1;
              uVar55 = uVar55 + 1;
              tmp->total_count_ = uVar55;
            } while (uVar55 < local_d0[uVar35 + 0x100]);
            lVar53 = lVar53 + uVar55;
          }
          lVar56 = 0;
          if (uVar35 != 0) {
            lVar56 = uVar35 - 1;
          }
          uVar55 = (ulong)local_60[lVar56];
          local_f8 = (HistogramCommand *)
                     BrotliHistogramBitCostDistanceLiteral(tmp,local_90 + uVar55,tmp + 1);
          if (sVar39 != 0) {
            sVar40 = 0;
            do {
              dVar57 = BrotliHistogramBitCostDistanceLiteral(tmp,local_90 + puVar18[sVar40],tmp + 1)
              ;
              if (dVar57 < (double)local_f8) {
                uVar55 = (ulong)puVar18[sVar40];
                local_f8 = (HistogramCommand *)dVar57;
              }
              sVar40 = sVar40 + 1;
            } while (sVar39 != sVar40);
          }
          local_60[uVar35] = (uint32_t)uVar55;
          if (*(int *)((long)local_108 + uVar55 * 4) == -1) {
            *(int *)((long)local_108 + uVar55 * 4) = iVar119;
            iVar119 = iVar119 + 1;
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar46);
      }
      BrotliFree(m,tmp);
      BrotliFree(m,puVar18);
      BrotliFree(m,local_90);
      uVar35 = literal_split->types_alloc_size;
      if (uVar35 < uVar46) {
        if (uVar35 == 0) {
          uVar35 = uVar46;
        }
        do {
          uVar55 = uVar35;
          uVar35 = uVar55 * 2;
        } while (uVar55 < uVar46);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar55);
        if (literal_split->types_alloc_size != 0) {
          switchD_012bc561::default(puVar17,literal_split->types,literal_split->types_alloc_size);
        }
        BrotliFree(m,literal_split->types);
        literal_split->types = puVar17;
        literal_split->types_alloc_size = uVar55;
      }
      uVar35 = literal_split->lengths_alloc_size;
      if (uVar35 < uVar46) {
        if (uVar35 == 0) {
          uVar35 = uVar46;
        }
        do {
          uVar55 = uVar35;
          uVar35 = uVar55 * 2;
        } while (uVar55 < uVar46);
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar55 * 4);
        if (literal_split->lengths_alloc_size != 0) {
          switchD_012bc561::default
                    (puVar18,literal_split->lengths,literal_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,literal_split->lengths);
        literal_split->lengths = puVar18;
        literal_split->lengths_alloc_size = uVar55;
LAB_01d45ad3:
        uVar43 = 0;
        sVar39 = 0;
        uVar38 = 0;
        uVar35 = 0;
        do {
          uVar38 = uVar38 + local_d0[uVar35 + 0x100];
          if ((uVar46 - 1 == uVar35) || (local_60[uVar35] != local_60[uVar35 + 1])) {
            uVar44 = uVar43 & 0xff;
            uVar3 = *(uint *)((long)local_108 + (ulong)local_60[uVar35] * 4);
            bVar45 = (byte)uVar3;
            literal_split->types[sVar39] = bVar45;
            bVar42 = (byte)uVar43;
            uVar43 = uVar3;
            if (bVar45 < bVar42) {
              uVar43 = uVar44;
            }
            literal_split->lengths[sVar39] = uVar38;
            sVar39 = sVar39 + 1;
            uVar38 = 0;
          }
          uVar35 = uVar35 + 1;
        } while (uVar46 != uVar35);
        sVar40 = (ulong)(uVar43 & 0xff) + 1;
      }
      else {
        if (uVar46 != 0) goto LAB_01d45ad3;
        sVar40 = 1;
        sVar39 = 0;
      }
      literal_split->num_blocks = sVar39;
      literal_split->num_types = sVar40;
      BrotliFree(m,local_108);
      BrotliFree(m,local_d0);
      BrotliFree(m,local_60);
      BrotliFree(m,pvVar23);
    }
  }
  BrotliFree(m,local_e0);
  if (num_commands == 0) {
    insert_and_copy_split->num_types = 1;
    BrotliFree(m,(void *)0x0);
    pvVar20 = (void *)0x0;
  }
  else {
    sVar39 = num_commands * 2;
    pvVar20 = BrotliAllocate(m,sVar39);
    puVar21 = &cmds->cmd_prefix_;
    sVar40 = 0;
    do {
      *(uint16_t *)((long)pvVar20 + sVar40 * 2) = *puVar21;
      sVar40 = sVar40 + 1;
      puVar21 = puVar21 + 8;
    } while (num_commands != sVar40);
    uVar35 = 0x32;
    if (num_commands < 0x6784) {
      uVar35 = (ulong)(((uint)num_commands & 0xffff) / 0x212 + 1);
    }
    if (num_commands < 0x80) {
      sVar40 = insert_and_copy_split->num_blocks;
      uVar55 = insert_and_copy_split->types_alloc_size;
      uVar35 = sVar40 + 1;
      if (uVar55 < uVar35) {
        if (uVar55 == 0) {
          uVar55 = uVar35;
        }
        do {
          uVar41 = uVar55;
          uVar55 = uVar41 * 2;
        } while (uVar41 < uVar35);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar41);
        if (insert_and_copy_split->types_alloc_size != 0) {
          switchD_012bc561::default
                    (puVar17,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar17;
        insert_and_copy_split->types_alloc_size = uVar41;
        sVar40 = insert_and_copy_split->num_blocks;
        uVar35 = sVar40 + 1;
      }
      uVar55 = insert_and_copy_split->lengths_alloc_size;
      if (uVar55 < uVar35) {
        if (uVar55 == 0) {
          uVar55 = uVar35;
        }
        do {
          uVar41 = uVar55;
          uVar55 = uVar41 * 2;
        } while (uVar41 < uVar35);
        puVar18 = (uint32_t *)BrotliAllocate(m,uVar41 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          switchD_012bc561::default
                    (puVar18,insert_and_copy_split->lengths,
                     insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar18;
        insert_and_copy_split->lengths_alloc_size = uVar41;
        sVar40 = insert_and_copy_split->num_blocks;
      }
      insert_and_copy_split->num_types = 1;
      insert_and_copy_split->types[sVar40] = '\0';
      sVar40 = insert_and_copy_split->num_blocks;
      insert_and_copy_split->lengths[sVar40] = (uint)num_commands;
      insert_and_copy_split->num_blocks = sVar40 + 1;
    }
    else {
      lVar53 = uVar35 * 0xb10;
      pvVar23 = BrotliAllocate(m,lVar53 + 0xb10);
      lVar56 = 0;
      do {
        switchD_012e5a64::default((void *)((long)pvVar23 + lVar56),0,0xb08);
        *(undefined8 *)((long)pvVar23 + lVar56 + 0xb08) = 0x7ff0000000000000;
        lVar56 = lVar56 + 0xb10;
      } while (lVar53 - lVar56 != 0);
      uVar41 = 0;
      uVar55 = 7;
      do {
        uVar46 = (uVar41 * num_commands) / uVar35;
        if (uVar41 != 0) {
          uVar55 = (ulong)(uint)((int)uVar55 * 0x41a7);
          uVar46 = uVar46 + uVar55 % (num_commands / uVar35);
        }
        if (num_commands <= uVar46 + 0x28) {
          uVar46 = num_commands - 0x29;
        }
        plVar2 = (long *)((long)pvVar23 + uVar41 * 0xb10 + 0xb00);
        *plVar2 = *plVar2 + 0x28;
        lVar56 = 0;
        do {
          piVar1 = (int *)((long)pvVar23 +
                          (ulong)*(ushort *)((long)pvVar20 + lVar56 * 2 + uVar46 * 2) * 4 +
                          uVar41 * 0xb10);
          *piVar1 = *piVar1 + 1;
          lVar56 = lVar56 + 1;
        } while (lVar56 != 0x28);
        uVar41 = uVar41 + 1;
      } while (uVar41 != uVar35);
      uVar55 = sVar39 / 0x28 + uVar35 + 99;
      if (uVar55 != uVar55 % uVar35) {
        pvVar54 = (void *)(lVar53 + (long)pvVar23);
        uVar46 = 7;
        uVar41 = 0;
        do {
          switchD_012e5a64::default(pvVar54,0,0xb00);
          uVar46 = (ulong)(uint)((int)uVar46 * 0x41a7);
          puVar25 = (ushort *)((long)pvVar20 + (uVar46 % (num_commands - 0x27)) * 2);
          *(undefined8 *)((long)pvVar54 + 0xb00) = 0x28;
          lVar53 = -0x28;
          do {
            uVar15 = *puVar25;
            puVar25 = puVar25 + 1;
            piVar1 = (int *)((long)pvVar54 + (ulong)uVar15 * 4);
            *piVar1 = *piVar1 + 1;
            lVar53 = lVar53 + 1;
          } while (lVar53 != 0);
          lVar53 = (uVar41 % uVar35) * 0xb10;
          plVar2 = (long *)((long)pvVar23 + lVar53 + 0xb00);
          *plVar2 = *plVar2 + 0x28;
          lVar56 = 0;
          do {
            piVar1 = (int *)((long)pvVar23 + lVar56 * 4 + lVar53);
            *piVar1 = *piVar1 + *(int *)((long)pvVar54 + lVar56 * 4);
            lVar56 = lVar56 + 1;
          } while (lVar56 != 0x2c0);
          uVar41 = uVar41 + 1;
        } while (uVar41 < uVar55 - uVar55 % uVar35);
        *(undefined8 *)((long)pvVar54 + 0xb08) = 0x7ff0000000000000;
      }
      pvVar54 = BrotliAllocate(m,num_commands);
      iVar119 = (int)uVar35;
      pvVar26 = BrotliAllocate(m,uVar35 * 0x1600);
      pvVar27 = BrotliAllocate(m,(ulong)(uint)(iVar119 * 8));
      sVar40 = (iVar119 + 7U >> 3) * num_commands;
      if (sVar40 == 0) {
        local_c8 = (void *)0x0;
      }
      else {
        local_c8 = BrotliAllocate(m,sVar40);
      }
      pvVar28 = BrotliAllocate(m,(ulong)(uint)(iVar119 * 2));
      lVar53 = 3;
      if (10 < params->quality) {
        lVar53 = 10;
      }
      lVar56 = 0;
      do {
        uVar55 = uVar35 + 7 >> 3;
        if (uVar35 < 2) {
          switchD_012e5a64::default(pvVar54,0,num_commands);
          uVar41 = 1;
          auVar137 = _DAT_01d9fb10;
        }
        else {
          switchD_012e5a64::default(pvVar26,0,uVar35 * 0x1600);
          uVar41 = 0;
          puVar36 = (uint *)((long)pvVar23 + 0xb00);
          do {
            uVar46 = (ulong)*puVar36;
            if (uVar46 < 0x100) {
              dVar57 = (double)(&kBrotliLog2Table)[uVar46];
            }
            else {
              dVar57 = log2((double)uVar46);
            }
            *(double *)((long)pvVar26 + uVar41 * 8) = dVar57;
            uVar41 = uVar41 + 1;
            puVar36 = puVar36 + 0x2c4;
          } while (uVar35 != uVar41);
          pvVar50 = (void *)(uVar35 * 0x15f8 + (long)pvVar26);
          lVar37 = 0x2c0;
          puVar36 = (uint *)((long)pvVar23 + 0xafc);
          do {
            lVar37 = lVar37 + -1;
            uVar41 = 0;
            puVar52 = puVar36;
            do {
              dVar65 = -2.0;
              dVar57 = *(double *)((long)pvVar26 + uVar41 * 8);
              uVar46 = (ulong)*puVar52;
              if (uVar46 != 0) {
                if (*puVar52 < 0x100) {
                  dVar65 = (double)(&kBrotliLog2Table)[uVar46];
                }
                else {
                  dVar65 = log2((double)uVar46);
                }
              }
              *(double *)((long)pvVar50 + uVar41 * 8) = dVar57 - dVar65;
              uVar41 = uVar41 + 1;
              puVar52 = puVar52 + 0x2c4;
            } while (uVar35 != uVar41);
            pvVar50 = (void *)((long)pvVar50 + uVar35 * -8);
            puVar36 = puVar36 + -1;
          } while (lVar37 != 0);
          switchD_012e5a64::default(pvVar27,0,uVar35 * 8);
          switchD_012e5a64::default(local_c8,0,uVar55 * num_commands);
          auVar137 = _DAT_01d9fb10;
          uVar41 = 0;
          do {
            uVar15 = *(ushort *)((long)pvVar20 + uVar41 * 2);
            uVar46 = 0;
            dVar57 = 1e+99;
            do {
              dVar65 = *(double *)((long)pvVar26 + uVar46 * 8 + uVar15 * uVar35 * 8) +
                       *(double *)((long)pvVar27 + uVar46 * 8);
              *(double *)((long)pvVar27 + uVar46 * 8) = dVar65;
              if (dVar65 < dVar57) {
                *(char *)((long)pvVar54 + uVar41) = (char)uVar46;
                dVar57 = dVar65;
              }
              uVar46 = uVar46 + 1;
            } while (uVar35 != uVar46);
            dVar65 = 13.5;
            if (uVar41 < 2000) {
              dVar65 = (((double)(long)uVar41 * 0.07) / 2000.0 + 0.77) * 13.5;
            }
            uVar46 = 0;
            do {
              dVar71 = *(double *)((long)pvVar27 + uVar46 * 8) - dVar57;
              *(double *)((long)pvVar27 + uVar46 * 8) = dVar71;
              if (dVar65 <= dVar71) {
                *(double *)((long)pvVar27 + uVar46 * 8) = dVar65;
                pbVar34 = (byte *)((long)local_c8 + (uVar46 >> 3) + uVar41 * uVar55);
                *pbVar34 = *pbVar34 | '\x01' << ((byte)uVar46 & 7);
              }
              uVar46 = uVar46 + 1;
            } while (uVar35 != uVar46);
            uVar41 = uVar41 + 1;
          } while (uVar41 != num_commands);
          bVar42 = *(byte *)((long)pvVar54 + (num_commands - 1));
          pvVar50 = (void *)((num_commands - 2) * uVar55 + (long)local_c8);
          uVar41 = 1;
          sVar40 = num_commands;
          do {
            if ((*(byte *)((long)pvVar50 + (ulong)(bVar42 >> 3)) >> (bVar42 & 7) & 1) != 0) {
              bVar45 = *(byte *)((long)pvVar54 + (sVar40 - 2));
              uVar41 = uVar41 + (bVar42 != bVar45);
              bVar42 = bVar45;
            }
            *(byte *)((long)pvVar54 + (sVar40 - 2)) = bVar42;
            pvVar50 = (void *)((long)pvVar50 - uVar55);
            sVar40 = sVar40 - 1;
          } while (sVar40 != 1);
        }
        if (uVar35 != 0) {
          lVar37 = uVar35 - 1;
          auVar59._8_4_ = (int)lVar37;
          auVar59._0_8_ = lVar37;
          auVar59._12_4_ = (int)((ulong)lVar37 >> 0x20);
          auVar59 = auVar59 ^ auVar137;
          lVar37 = 0;
          auVar67 = _DAT_01d9fb00;
          auVar72 = _DAT_01da0bd0;
          auVar74 = _DAT_01da0bc0;
          auVar76 = _DAT_01da0bb0;
          do {
            auVar94 = auVar67 ^ auVar137;
            iVar119 = auVar59._0_4_;
            iVar118 = -(uint)(iVar119 < auVar94._0_4_);
            iVar63 = auVar59._4_4_;
            auVar87._4_4_ = -(uint)(iVar63 < auVar94._4_4_);
            iVar127 = auVar59._8_4_;
            iVar126 = -(uint)(iVar127 < auVar94._8_4_);
            iVar64 = auVar59._12_4_;
            auVar87._12_4_ = -(uint)(iVar64 < auVar94._12_4_);
            auVar109._4_4_ = iVar118;
            auVar109._0_4_ = iVar118;
            auVar109._8_4_ = iVar126;
            auVar109._12_4_ = iVar126;
            auVar132 = pshuflw(in_XMM8,auVar109,0xe8);
            auVar86._4_4_ = -(uint)(auVar94._4_4_ == iVar63);
            auVar86._12_4_ = -(uint)(auVar94._12_4_ == iVar64);
            auVar86._0_4_ = auVar86._4_4_;
            auVar86._8_4_ = auVar86._12_4_;
            auVar136 = pshuflw(in_XMM9,auVar86,0xe8);
            auVar87._0_4_ = auVar87._4_4_;
            auVar87._8_4_ = auVar87._12_4_;
            auVar94 = pshuflw(auVar132,auVar87,0xe8);
            auVar130._8_4_ = 0xffffffff;
            auVar130._0_8_ = 0xffffffffffffffff;
            auVar130._12_4_ = 0xffffffff;
            auVar130 = (auVar94 | auVar136 & auVar132) ^ auVar130;
            auVar94 = packssdw(auVar130,auVar130);
            if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar28 + lVar37) = 0x100;
            }
            auVar87 = auVar86 & auVar109 | auVar87;
            auVar94 = packssdw(auVar87,auVar87);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar94 = packssdw(auVar94 ^ auVar9,auVar94 ^ auVar9);
            if ((auVar94._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)((long)pvVar28 + lVar37 + 2) = 0x100;
            }
            auVar94 = auVar72 ^ auVar137;
            iVar118 = -(uint)(iVar119 < auVar94._0_4_);
            auVar122._4_4_ = -(uint)(iVar63 < auVar94._4_4_);
            iVar126 = -(uint)(iVar127 < auVar94._8_4_);
            auVar122._12_4_ = -(uint)(iVar64 < auVar94._12_4_);
            auVar88._4_4_ = iVar118;
            auVar88._0_4_ = iVar118;
            auVar88._8_4_ = iVar126;
            auVar88._12_4_ = iVar126;
            auVar110._4_4_ = -(uint)(auVar94._4_4_ == iVar63);
            auVar110._12_4_ = -(uint)(auVar94._12_4_ == iVar64);
            auVar110._0_4_ = auVar110._4_4_;
            auVar110._8_4_ = auVar110._12_4_;
            auVar122._0_4_ = auVar122._4_4_;
            auVar122._8_4_ = auVar122._12_4_;
            auVar94 = auVar110 & auVar88 | auVar122;
            auVar94 = packssdw(auVar94,auVar94);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar94 = packssdw(auVar94 ^ auVar10,auVar94 ^ auVar10);
            if ((auVar94 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar28 + lVar37 + 4) = 0x100;
            }
            auVar98 = pshufhw(auVar88,auVar88,0x84);
            auVar115 = pshufhw(auVar110,auVar110,0x84);
            auVar99 = pshufhw(auVar98,auVar122,0x84);
            auVar89._8_4_ = 0xffffffff;
            auVar89._0_8_ = 0xffffffffffffffff;
            auVar89._12_4_ = 0xffffffff;
            auVar89 = (auVar99 | auVar115 & auVar98) ^ auVar89;
            auVar98 = packssdw(auVar89,auVar89);
            if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar28 + lVar37 + 6) = 0x100;
            }
            auVar98 = auVar74 ^ auVar137;
            iVar118 = -(uint)(iVar119 < auVar98._0_4_);
            auVar91._4_4_ = -(uint)(iVar63 < auVar98._4_4_);
            iVar126 = -(uint)(iVar127 < auVar98._8_4_);
            auVar91._12_4_ = -(uint)(iVar64 < auVar98._12_4_);
            auVar111._4_4_ = iVar118;
            auVar111._0_4_ = iVar118;
            auVar111._8_4_ = iVar126;
            auVar111._12_4_ = iVar126;
            auVar94 = pshuflw(auVar94,auVar111,0xe8);
            auVar90._4_4_ = -(uint)(auVar98._4_4_ == iVar63);
            auVar90._12_4_ = -(uint)(auVar98._12_4_ == iVar64);
            auVar90._0_4_ = auVar90._4_4_;
            auVar90._8_4_ = auVar90._12_4_;
            in_XMM9 = pshuflw(auVar136 & auVar132,auVar90,0xe8);
            in_XMM9 = in_XMM9 & auVar94;
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            auVar94 = pshuflw(auVar94,auVar91,0xe8);
            auVar131._8_4_ = 0xffffffff;
            auVar131._0_8_ = 0xffffffffffffffff;
            auVar131._12_4_ = 0xffffffff;
            auVar131 = (auVar94 | in_XMM9) ^ auVar131;
            auVar94 = packssdw(auVar131,auVar131);
            if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar28 + lVar37 + 8) = 0x100;
            }
            auVar91 = auVar90 & auVar111 | auVar91;
            auVar94 = packssdw(auVar91,auVar91);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar94 = packssdw(auVar94 ^ auVar11,auVar94 ^ auVar11);
            if ((auVar94 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar28 + lVar37 + 10) = 0x100;
            }
            auVar94 = auVar76 ^ auVar137;
            iVar119 = -(uint)(iVar119 < auVar94._0_4_);
            auVar123._4_4_ = -(uint)(iVar63 < auVar94._4_4_);
            iVar127 = -(uint)(iVar127 < auVar94._8_4_);
            auVar123._12_4_ = -(uint)(iVar64 < auVar94._12_4_);
            auVar92._4_4_ = iVar119;
            auVar92._0_4_ = iVar119;
            auVar92._8_4_ = iVar127;
            auVar92._12_4_ = iVar127;
            auVar112._4_4_ = -(uint)(auVar94._4_4_ == iVar63);
            auVar112._12_4_ = -(uint)(auVar94._12_4_ == iVar64);
            auVar112._0_4_ = auVar112._4_4_;
            auVar112._8_4_ = auVar112._12_4_;
            auVar123._0_4_ = auVar123._4_4_;
            auVar123._8_4_ = auVar123._12_4_;
            auVar94 = auVar112 & auVar92 | auVar123;
            auVar94 = packssdw(auVar94,auVar94);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar94 ^ auVar12,auVar94 ^ auVar12);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar28 + lVar37 + 0xc) = 0x100;
            }
            auVar94 = pshufhw(auVar92,auVar92,0x84);
            auVar136 = pshufhw(auVar112,auVar112,0x84);
            auVar132 = pshufhw(auVar94,auVar123,0x84);
            auVar93._8_4_ = 0xffffffff;
            auVar93._0_8_ = 0xffffffffffffffff;
            auVar93._12_4_ = 0xffffffff;
            auVar93 = (auVar132 | auVar136 & auVar94) ^ auVar93;
            auVar94 = packssdw(auVar93,auVar93);
            if ((auVar94 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)((long)pvVar28 + lVar37 + 0xe) = 0x100;
            }
            lVar48 = auVar67._8_8_;
            auVar67._0_8_ = auVar67._0_8_ + 8;
            auVar67._8_8_ = lVar48 + 8;
            lVar48 = auVar72._8_8_;
            auVar72._0_8_ = auVar72._0_8_ + 8;
            auVar72._8_8_ = lVar48 + 8;
            lVar48 = auVar74._8_8_;
            auVar74._0_8_ = auVar74._0_8_ + 8;
            auVar74._8_8_ = lVar48 + 8;
            lVar48 = auVar76._8_8_;
            auVar76._0_8_ = auVar76._0_8_ + 8;
            auVar76._8_8_ = lVar48 + 8;
            lVar37 = lVar37 + 0x10;
          } while (uVar55 * 0x10 != lVar37);
        }
        sVar40 = 0;
        uVar15 = 0;
        do {
          if (*(short *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar54 + sVar40) * 2) == 0x100) {
            *(ushort *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar54 + sVar40) * 2) = uVar15;
            uVar15 = uVar15 + 1;
          }
          sVar40 = sVar40 + 1;
        } while (num_commands != sVar40);
        sVar40 = 0;
        do {
          *(undefined1 *)((long)pvVar54 + sVar40) =
               *(undefined1 *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar54 + sVar40) * 2);
          sVar40 = sVar40 + 1;
        } while (num_commands != sVar40);
        uVar35 = (ulong)uVar15;
        if (uVar15 != 0) {
          lVar37 = 0;
          do {
            switchD_012e5a64::default((void *)((long)pvVar23 + lVar37),0,0xb08);
            *(undefined8 *)((long)pvVar23 + lVar37 + 0xb08) = 0x7ff0000000000000;
            lVar37 = lVar37 + 0xb10;
          } while (uVar35 * 0xb10 != lVar37);
        }
        sVar40 = 0;
        do {
          lVar37 = (ulong)*(byte *)((long)pvVar54 + sVar40) * 0xb10;
          piVar1 = (int *)((long)pvVar23 +
                          (ulong)*(ushort *)((long)pvVar20 + sVar40 * 2) * 4 + lVar37);
          *piVar1 = *piVar1 + 1;
          plVar2 = (long *)((long)pvVar23 + lVar37 + 0xb00);
          *plVar2 = *plVar2 + 1;
          sVar40 = sVar40 + 1;
        } while (num_commands != sVar40);
        lVar56 = lVar56 + 1;
      } while (lVar56 != lVar53);
      BrotliFree(m,pvVar26);
      BrotliFree(m,pvVar27);
      BrotliFree(m,local_c8);
      BrotliFree(m,pvVar28);
      BrotliFree(m,pvVar23);
      if (uVar41 == 0) {
        lVar53 = 0x100;
        local_a0 = (HistogramPair *)0x0;
LAB_01d4664a:
        puVar18 = (uint32_t *)BrotliAllocate(m,lVar53 * 4);
        uVar35 = uVar41 * 0x10 + 0x3f0;
        local_110 = (void *)(uVar35 >> 6);
        if (0x3f < uVar35) goto LAB_01d4669c;
        local_108 = (HistogramCommand *)0x0;
        puVar30 = (uint32_t *)0x0;
      }
      else {
        local_a0 = (HistogramPair *)BrotliAllocate(m,uVar41 * 4);
        lVar53 = uVar41 + 0x100;
        if (lVar53 != 0) goto LAB_01d4664a;
        local_110 = (void *)0x3ffffffffffffcf;
        lVar53 = 0;
        puVar18 = (uint32_t *)0x0;
LAB_01d4669c:
        local_108 = (HistogramCommand *)BrotliAllocate(m,(long)local_110 * 0xb10);
        puVar30 = (uint32_t *)BrotliAllocate(m,(long)local_110 * 4);
      }
      if (uVar41 == 0) {
        local_f8 = (HistogramCommand *)0x0;
      }
      else {
        uVar35 = 0x40;
        if (uVar41 < 0x40) {
          uVar35 = uVar41;
        }
        local_f8 = (HistogramCommand *)BrotliAllocate(m,uVar35 * 0xb10);
      }
      local_80 = (HistogramPair *)BrotliAllocate(m,0xc018);
      tmp_00 = (HistogramCommand *)BrotliAllocate(m,0x1620);
      lVar56 = 0;
      switchD_012e5a64::default(puVar18,0,lVar53 << 2);
      sVar40 = 0;
      do {
        puVar18[lVar56 + 0x100] = puVar18[lVar56 + 0x100] + 1;
        if ((num_commands - 1 == sVar40) ||
           (*(char *)((long)pvVar54 + sVar40) != *(char *)((long)pvVar54 + sVar40 + 1))) {
          lVar56 = lVar56 + 1;
        }
        sVar40 = sVar40 + 1;
      } while (num_commands != sVar40);
      if (uVar41 == 0) {
        local_d8 = 0;
      }
      else {
        local_c0 = (void *)0x0;
        local_68 = local_108;
        local_b0 = (HistogramDistance *)0x0;
        local_d8 = 0;
        lVar53 = 0;
        uVar55 = 0;
        pvVar23 = local_110;
        uVar35 = uVar41;
        pHVar47 = local_a0;
        do {
          uVar46 = 0x40;
          if (uVar35 < 0x40) {
            uVar46 = uVar35;
          }
          lVar56 = uVar46 + (uVar46 == 0);
          lVar37 = 0;
          do {
            uVar24 = (ulong)puVar18[uVar55 + lVar37 + 0x100];
            pHVar49 = local_f8 + lVar37;
            switchD_012e5a64::default(pHVar49,0,0xb08);
            local_f8[lVar37].bit_cost_ = INFINITY;
            uVar46 = uVar24;
            if (uVar24 != 0) {
              do {
                lVar48 = lVar53 * 2;
                lVar53 = lVar53 + 1;
                pHVar49->data_[*(ushort *)((long)pvVar20 + lVar48)] =
                     pHVar49->data_[*(ushort *)((long)pvVar20 + lVar48)] + 1;
                uVar46 = uVar46 - 1;
              } while (uVar46 != 0);
              pHVar49->total_count_ = uVar24;
            }
            dVar57 = BrotliPopulationCostCommand(pHVar49);
            pHVar49->bit_cost_ = dVar57;
            puVar18[lVar37 + 0x40] = (uint32_t)lVar37;
            puVar18[lVar37 + 0x80] = (uint32_t)lVar37;
            puVar18[lVar37] = 1;
            lVar37 = lVar37 + 1;
          } while (lVar37 != lVar56);
          sVar40 = uVar41 - uVar55;
          if (0x3f < sVar40) {
            sVar40 = 0x40;
          }
          sVar40 = BrotliHistogramCombineCommand
                             (local_f8,tmp_00,puVar18,puVar18 + 0x80,puVar18 + 0x40,local_80,sVar40,
                              sVar40,0x40,0x800);
          uVar46 = (long)local_c0 + sVar40;
          if (local_110 < uVar46) {
            pvVar26 = local_110;
            if (local_110 == (void *)0x0) {
              pvVar26 = (void *)uVar46;
            }
            do {
              uVar24 = (ulong)pvVar26;
              pvVar26 = (void *)(uVar24 * 2);
            } while (uVar24 < uVar46);
            local_108 = (HistogramCommand *)BrotliAllocate(m,uVar24 * 0xb10);
            if (local_110 != (void *)0x0) {
              switchD_012bc561::default(local_108,local_68,(long)local_110 * 0xb10);
            }
            BrotliFree(m,local_68);
            local_110 = (void *)uVar24;
          }
          else {
            local_108 = local_68;
          }
          uVar46 = (long)local_b0 + sVar40;
          if (pvVar23 < uVar46) {
            uVar24 = (ulong)pvVar23;
            if (pvVar23 == (void *)0x0) {
              uVar24 = uVar46;
            }
            do {
              uVar33 = uVar24;
              uVar24 = uVar33 * 2;
            } while (uVar33 < uVar46);
            puVar22 = (uint32_t *)BrotliAllocate(m,uVar33 * 4);
            if (pvVar23 != (void *)0x0) {
              switchD_012bc561::default(puVar22,puVar30,(long)pvVar23 << 2);
            }
            BrotliFree(m,puVar30);
            pvVar23 = (void *)uVar33;
            puVar30 = puVar22;
          }
          if (sVar40 != 0) {
            pHVar49 = local_108 + (long)local_c0;
            sVar51 = 0;
            do {
              switchD_012bc561::default(pHVar49,local_f8 + puVar18[sVar51 + 0x40],0xb10);
              puVar30[(long)local_b0 + sVar51] = puVar18[puVar18[sVar51 + 0x40]];
              puVar18[(ulong)puVar18[sVar51 + 0x40] + 0xc0] = (uint32_t)sVar51;
              sVar51 = sVar51 + 1;
              pHVar49 = pHVar49 + 1;
            } while (sVar40 != sVar51);
            local_c0 = (void *)((long)local_c0 + sVar51);
            local_b0 = (HistogramDistance *)((long)local_b0 + sVar51);
          }
          lVar37 = 0;
          do {
            *(uint32_t *)((long)pHVar47 + lVar37 * 4) =
                 puVar18[(ulong)puVar18[lVar37 + 0x80] + 0xc0] + (int)local_d8;
            lVar37 = lVar37 + 1;
          } while (lVar56 != lVar37);
          local_d8 = local_d8 + sVar40;
          uVar55 = uVar55 + 0x40;
          uVar35 = uVar35 - 0x40;
          pHVar47 = (HistogramPair *)((long)pHVar47 + 0x100);
          local_68 = local_108;
        } while (uVar55 < uVar41);
      }
      BrotliFree(m,local_f8);
      uVar35 = (local_d8 >> 1) * local_d8;
      if (local_d8 << 6 < uVar35) {
        uVar35 = local_d8 << 6;
      }
      if (0x800 < uVar35) {
        BrotliFree(m,local_80);
        local_80 = (HistogramPair *)BrotliAllocate(m,uVar35 * 0x18 + 0x18);
      }
      if (local_d8 == 0) {
        puVar22 = (uint32_t *)0x0;
      }
      else {
        puVar22 = (uint32_t *)BrotliAllocate(m,local_d8 * 4);
        auVar94 = _DAT_01da0ae0;
        auVar137 = _DAT_01d9fb10;
        lVar53 = local_d8 - 1;
        auVar60._8_4_ = (int)lVar53;
        auVar60._0_8_ = lVar53;
        auVar60._12_4_ = (int)((ulong)lVar53 >> 0x20);
        uVar55 = 0;
        auVar60 = auVar60 ^ _DAT_01d9fb10;
        auVar68 = _DAT_01d9fb00;
        do {
          bVar4 = auVar60._0_4_ < SUB164(auVar68 ^ auVar137,0);
          iVar119 = auVar60._4_4_;
          iVar63 = SUB164(auVar68 ^ auVar137,4);
          if ((bool)(~(iVar119 < iVar63 || iVar63 == iVar119 && bVar4) & 1)) {
            puVar22[uVar55] = (uint32_t)uVar55;
          }
          if (iVar119 >= iVar63 && (iVar63 != iVar119 || !bVar4)) {
            puVar22[uVar55 + 1] = (uint32_t)uVar55 + 1;
          }
          uVar55 = uVar55 + 2;
          lVar53 = auVar68._8_8_;
          auVar68._0_8_ = auVar68._0_8_ + auVar94._0_8_;
          auVar68._8_8_ = lVar53 + auVar94._8_8_;
        } while ((local_d8 + 1 & 0xfffffffffffffffe) != uVar55);
      }
      sVar40 = BrotliHistogramCombineCommand
                         (local_108,tmp_00,puVar30,&local_a0->idx1,puVar22,local_80,local_d8,uVar41,
                          0x100,uVar35);
      BrotliFree(m,local_80);
      BrotliFree(m,puVar30);
      if (local_d8 == 0) {
        local_110 = (void *)0x0;
      }
      else {
        local_110 = BrotliAllocate(m,local_d8 << 2);
        switchD_012e5a64::default(local_110,0xff,local_d8 << 2);
      }
      if (uVar41 != 0) {
        iVar119 = 0;
        local_e8 = (void *)0x0;
        uVar35 = 0;
        do {
          switchD_012e5a64::default(tmp_00,0,0xb08);
          tmp_00->bit_cost_ = INFINITY;
          if (puVar18[uVar35 + 0x100] != 0) {
            uVar55 = 0;
            do {
              tmp_00->data_[*(ushort *)((long)pvVar20 + uVar55 * 2 + (long)local_e8 * 2)] =
                   tmp_00->data_[*(ushort *)((long)pvVar20 + uVar55 * 2 + (long)local_e8 * 2)] + 1;
              uVar55 = uVar55 + 1;
            } while (uVar55 < puVar18[uVar35 + 0x100]);
            tmp_00->total_count_ = uVar55;
            local_e8 = (void *)((long)local_e8 + uVar55);
          }
          lVar53 = 0;
          if (uVar35 != 0) {
            lVar53 = uVar35 - 1;
          }
          uVar43 = *(uint *)((long)local_a0 + lVar53 * 4);
          uVar55 = (ulong)uVar43;
          local_f8 = (HistogramCommand *)
                     BrotliHistogramBitCostDistanceCommand(tmp_00,local_108 + uVar55,tmp_00 + 1);
          if (sVar40 != 0) {
            sVar51 = 0;
            do {
              dVar57 = BrotliHistogramBitCostDistanceCommand
                                 (tmp_00,local_108 + puVar22[sVar51],tmp_00 + 1);
              if (dVar57 < (double)local_f8) {
                uVar55 = (ulong)puVar22[sVar51];
                local_f8 = (HistogramCommand *)dVar57;
              }
              uVar43 = (uint)uVar55;
              sVar51 = sVar51 + 1;
            } while (sVar40 != sVar51);
          }
          *(uint *)((long)local_a0 + uVar35 * 4) = uVar43;
          if (*(int *)((long)local_110 + uVar55 * 4) == -1) {
            *(int *)((long)local_110 + uVar55 * 4) = iVar119;
            iVar119 = iVar119 + 1;
          }
          uVar35 = uVar35 + 1;
        } while (uVar35 != uVar41);
      }
      BrotliFree(m,tmp_00);
      BrotliFree(m,puVar22);
      BrotliFree(m,local_108);
      uVar35 = insert_and_copy_split->types_alloc_size;
      if (uVar35 < uVar41) {
        if (uVar35 == 0) {
          uVar35 = uVar41;
        }
        do {
          uVar55 = uVar35;
          uVar35 = uVar55 * 2;
        } while (uVar55 < uVar41);
        puVar17 = (uint8_t *)BrotliAllocate(m,uVar55);
        if (insert_and_copy_split->types_alloc_size != 0) {
          switchD_012bc561::default
                    (puVar17,insert_and_copy_split->types,insert_and_copy_split->types_alloc_size);
        }
        BrotliFree(m,insert_and_copy_split->types);
        insert_and_copy_split->types = puVar17;
        insert_and_copy_split->types_alloc_size = uVar55;
      }
      uVar35 = insert_and_copy_split->lengths_alloc_size;
      if (uVar35 < uVar41) {
        if (uVar35 == 0) {
          uVar35 = uVar41;
        }
        do {
          uVar55 = uVar35;
          uVar35 = uVar55 * 2;
        } while (uVar55 < uVar41);
        puVar30 = (uint32_t *)BrotliAllocate(m,uVar55 * 4);
        if (insert_and_copy_split->lengths_alloc_size != 0) {
          switchD_012bc561::default
                    (puVar30,insert_and_copy_split->lengths,
                     insert_and_copy_split->lengths_alloc_size << 2);
        }
        BrotliFree(m,insert_and_copy_split->lengths);
        insert_and_copy_split->lengths = puVar30;
        insert_and_copy_split->lengths_alloc_size = uVar55;
LAB_01d46fe5:
        uVar43 = 0;
        sVar40 = 0;
        uVar38 = 0;
        uVar35 = 0;
        do {
          uVar38 = uVar38 + puVar18[uVar35 + 0x100];
          if ((uVar41 - 1 == uVar35) ||
             (*(uint *)((long)local_a0 + uVar35 * 4) != *(uint *)((long)local_a0 + (uVar35 + 1) * 4)
             )) {
            uVar44 = uVar43 & 0xff;
            uVar3 = *(uint *)((long)local_110 + (ulong)*(uint *)((long)local_a0 + uVar35 * 4) * 4);
            bVar45 = (byte)uVar3;
            insert_and_copy_split->types[sVar40] = bVar45;
            bVar42 = (byte)uVar43;
            uVar43 = uVar3;
            if (bVar45 < bVar42) {
              uVar43 = uVar44;
            }
            insert_and_copy_split->lengths[sVar40] = uVar38;
            sVar40 = sVar40 + 1;
            uVar38 = 0;
          }
          uVar35 = uVar35 + 1;
        } while (uVar41 != uVar35);
        sVar51 = (ulong)(uVar43 & 0xff) + 1;
      }
      else {
        if (uVar41 != 0) goto LAB_01d46fe5;
        sVar51 = 1;
        sVar40 = 0;
      }
      insert_and_copy_split->num_blocks = sVar40;
      insert_and_copy_split->num_types = sVar51;
      BrotliFree(m,local_110);
      BrotliFree(m,puVar18);
      BrotliFree(m,local_a0);
      BrotliFree(m,pvVar54);
    }
    BrotliFree(m,pvVar20);
    pvVar20 = BrotliAllocate(m,sVar39);
    if (num_commands != 0) {
      puVar21 = &cmds->dist_prefix_;
      uVar35 = 0;
      do {
        if (((*(uint *)(puVar21 + -5) & 0x1ffffff) != 0) && (0x7f < puVar21[-1])) {
          *(uint16_t *)((long)pvVar20 + uVar35 * 2) = *puVar21 & 0x3ff;
          uVar35 = uVar35 + 1;
        }
        puVar21 = puVar21 + 8;
        num_commands = num_commands - 1;
      } while (num_commands != 0);
      uVar55 = 0x32;
      if (uVar35 < 0x6a40) {
        uVar55 = (ulong)(((uint)uVar35 & 0xffff) / 0x220 + 1);
      }
      if (uVar35 != 0) {
        if (uVar35 < 0x80) {
          sVar39 = dist_split->num_blocks;
          uVar41 = dist_split->types_alloc_size;
          uVar55 = sVar39 + 1;
          if (uVar41 < uVar55) {
            if (uVar41 == 0) {
              uVar41 = uVar55;
            }
            do {
              uVar46 = uVar41;
              uVar41 = uVar46 * 2;
            } while (uVar46 < uVar55);
            puVar17 = (uint8_t *)BrotliAllocate(m,uVar46);
            if (dist_split->types_alloc_size != 0) {
              switchD_012bc561::default(puVar17,dist_split->types,dist_split->types_alloc_size);
            }
            BrotliFree(m,dist_split->types);
            dist_split->types = puVar17;
            dist_split->types_alloc_size = uVar46;
            sVar39 = dist_split->num_blocks;
            uVar55 = sVar39 + 1;
          }
          uVar41 = dist_split->lengths_alloc_size;
          if (uVar41 < uVar55) {
            if (uVar41 == 0) {
              uVar41 = uVar55;
            }
            do {
              uVar46 = uVar41;
              uVar41 = uVar46 * 2;
            } while (uVar46 < uVar55);
            puVar18 = (uint32_t *)BrotliAllocate(m,uVar46 * 4);
            if (dist_split->lengths_alloc_size != 0) {
              switchD_012bc561::default
                        (puVar18,dist_split->lengths,dist_split->lengths_alloc_size << 2);
            }
            BrotliFree(m,dist_split->lengths);
            dist_split->lengths = puVar18;
            dist_split->lengths_alloc_size = uVar46;
            sVar39 = dist_split->num_blocks;
          }
          dist_split->num_types = 1;
          dist_split->types[sVar39] = '\0';
          sVar39 = dist_split->num_blocks;
          dist_split->lengths[sVar39] = (uint)uVar35;
          dist_split->num_blocks = sVar39 + 1;
          goto LAB_01d4721f;
        }
        lVar53 = uVar55 * 0x890;
        pvVar23 = BrotliAllocate(m,lVar53 + 0x890);
        lVar56 = 0;
        do {
          switchD_012e5a64::default((void *)((long)pvVar23 + lVar56),0,0x888);
          *(undefined8 *)((long)pvVar23 + lVar56 + 0x888) = 0x7ff0000000000000;
          lVar56 = lVar56 + 0x890;
        } while (lVar53 - lVar56 != 0);
        uVar46 = 0;
        uVar41 = 7;
        do {
          uVar24 = (uVar46 * uVar35) / uVar55;
          if (uVar46 != 0) {
            uVar41 = (ulong)(uint)((int)uVar41 * 0x41a7);
            uVar24 = uVar24 + uVar41 % (uVar35 / uVar55);
          }
          if (uVar35 <= uVar24 + 0x28) {
            uVar24 = uVar35 - 0x29;
          }
          plVar2 = (long *)((long)pvVar23 + uVar46 * 0x890 + 0x880);
          *plVar2 = *plVar2 + 0x28;
          lVar56 = 0;
          do {
            piVar1 = (int *)((long)pvVar23 +
                            (ulong)*(ushort *)((long)pvVar20 + lVar56 * 2 + uVar24 * 2) * 4 +
                            uVar46 * 0x890);
            *piVar1 = *piVar1 + 1;
            lVar56 = lVar56 + 1;
          } while (lVar56 != 0x28);
          uVar46 = uVar46 + 1;
        } while (uVar46 != uVar55);
        uVar41 = (uVar35 * 2) / 0x28 + uVar55 + 99;
        if (uVar41 != uVar41 % uVar55) {
          pvVar54 = (void *)(lVar53 + (long)pvVar23);
          uVar24 = 7;
          uVar46 = 0;
          do {
            switchD_012e5a64::default(pvVar54,0,0x880);
            uVar24 = (ulong)(uint)((int)uVar24 * 0x41a7);
            puVar25 = (ushort *)((long)pvVar20 + (uVar24 % (uVar35 - 0x27)) * 2);
            *(undefined8 *)((long)pvVar54 + 0x880) = 0x28;
            lVar53 = -0x28;
            do {
              uVar15 = *puVar25;
              puVar25 = puVar25 + 1;
              piVar1 = (int *)((long)pvVar54 + (ulong)uVar15 * 4);
              *piVar1 = *piVar1 + 1;
              lVar53 = lVar53 + 1;
            } while (lVar53 != 0);
            lVar53 = (uVar46 % uVar55) * 0x890;
            plVar2 = (long *)((long)pvVar23 + lVar53 + 0x880);
            *plVar2 = *plVar2 + 0x28;
            lVar56 = 0;
            do {
              piVar1 = (int *)((long)pvVar23 + lVar56 * 4 + lVar53);
              *piVar1 = *piVar1 + *(int *)((long)pvVar54 + lVar56 * 4);
              lVar56 = lVar56 + 1;
            } while (lVar56 != 0x220);
            uVar46 = uVar46 + 1;
          } while (uVar46 < uVar41 - uVar41 % uVar55);
          *(undefined8 *)((long)pvVar54 + 0x888) = 0x7ff0000000000000;
        }
        pvVar54 = BrotliAllocate(m,uVar35);
        iVar119 = (int)uVar55;
        pvVar26 = BrotliAllocate(m,uVar55 * 0x1100);
        pvVar27 = BrotliAllocate(m,(ulong)(uint)(iVar119 * 8));
        sVar39 = (iVar119 + 7U >> 3) * uVar35;
        if (sVar39 == 0) {
          local_c8 = (void *)0x0;
        }
        else {
          local_c8 = BrotliAllocate(m,sVar39);
        }
        pvVar28 = BrotliAllocate(m,(ulong)(uint)(iVar119 * 2));
        lVar53 = 3;
        if (10 < params->quality) {
          lVar53 = 10;
        }
        lVar56 = 0;
        do {
          uVar41 = uVar55 + 7 >> 3;
          if (uVar55 < 2) {
            switchD_012e5a64::default(pvVar54,0,uVar35);
            uVar24 = 1;
            auVar137 = _DAT_01d9fb10;
          }
          else {
            switchD_012e5a64::default(pvVar26,0,uVar55 * 0x1100);
            uVar46 = 0;
            puVar36 = (uint *)((long)pvVar23 + 0x880);
            do {
              uVar24 = (ulong)*puVar36;
              if (uVar24 < 0x100) {
                dVar57 = (double)(&kBrotliLog2Table)[uVar24];
              }
              else {
                dVar57 = log2((double)uVar24);
              }
              *(double *)((long)pvVar26 + uVar46 * 8) = dVar57;
              uVar46 = uVar46 + 1;
              puVar36 = puVar36 + 0x224;
            } while (uVar55 != uVar46);
            pvVar50 = (void *)(uVar55 * 0x10f8 + (long)pvVar26);
            lVar37 = 0x220;
            puVar36 = (uint *)((long)pvVar23 + 0x87c);
            do {
              lVar37 = lVar37 + -1;
              uVar46 = 0;
              puVar52 = puVar36;
              do {
                dVar65 = -2.0;
                dVar57 = *(double *)((long)pvVar26 + uVar46 * 8);
                uVar24 = (ulong)*puVar52;
                if (uVar24 != 0) {
                  if (*puVar52 < 0x100) {
                    dVar65 = (double)(&kBrotliLog2Table)[uVar24];
                  }
                  else {
                    dVar65 = log2((double)uVar24);
                  }
                }
                *(double *)((long)pvVar50 + uVar46 * 8) = dVar57 - dVar65;
                uVar46 = uVar46 + 1;
                puVar52 = puVar52 + 0x224;
              } while (uVar55 != uVar46);
              pvVar50 = (void *)((long)pvVar50 + uVar55 * -8);
              puVar36 = puVar36 + -1;
            } while (lVar37 != 0);
            switchD_012e5a64::default(pvVar27,0,uVar55 * 8);
            switchD_012e5a64::default(local_c8,0,uVar41 * uVar35);
            auVar137 = _DAT_01d9fb10;
            uVar46 = 0;
            do {
              uVar15 = *(ushort *)((long)pvVar20 + uVar46 * 2);
              uVar24 = 0;
              dVar57 = 1e+99;
              do {
                dVar65 = *(double *)((long)pvVar26 + uVar24 * 8 + uVar15 * uVar55 * 8) +
                         *(double *)((long)pvVar27 + uVar24 * 8);
                *(double *)((long)pvVar27 + uVar24 * 8) = dVar65;
                if (dVar65 < dVar57) {
                  *(char *)((long)pvVar54 + uVar46) = (char)uVar24;
                  dVar57 = dVar65;
                }
                uVar24 = uVar24 + 1;
              } while (uVar55 != uVar24);
              dVar65 = 14.6;
              if (uVar46 < 2000) {
                dVar65 = (((double)(long)uVar46 * 0.07) / 2000.0 + 0.77) * 14.6;
              }
              uVar24 = 0;
              do {
                dVar71 = *(double *)((long)pvVar27 + uVar24 * 8) - dVar57;
                *(double *)((long)pvVar27 + uVar24 * 8) = dVar71;
                if (dVar65 <= dVar71) {
                  *(double *)((long)pvVar27 + uVar24 * 8) = dVar65;
                  pbVar34 = (byte *)((long)local_c8 + (uVar24 >> 3) + uVar46 * uVar41);
                  *pbVar34 = *pbVar34 | '\x01' << ((byte)uVar24 & 7);
                }
                uVar24 = uVar24 + 1;
              } while (uVar55 != uVar24);
              uVar46 = uVar46 + 1;
            } while (uVar46 != uVar35);
            bVar42 = *(byte *)((long)pvVar54 + (uVar35 - 1));
            pvVar50 = (void *)((uVar35 - 2) * uVar41 + (long)local_c8);
            uVar24 = 1;
            uVar46 = uVar35;
            do {
              if ((*(byte *)((long)pvVar50 + (ulong)(bVar42 >> 3)) >> (bVar42 & 7) & 1) != 0) {
                bVar45 = *(byte *)((long)pvVar54 + (uVar46 - 2));
                uVar24 = uVar24 + (bVar42 != bVar45);
                bVar42 = bVar45;
              }
              *(byte *)((long)pvVar54 + (uVar46 - 2)) = bVar42;
              pvVar50 = (void *)((long)pvVar50 - uVar41);
              uVar46 = uVar46 - 1;
            } while (uVar46 != 1);
          }
          if (uVar55 != 0) {
            lVar37 = uVar55 - 1;
            auVar61._8_4_ = (int)lVar37;
            auVar61._0_8_ = lVar37;
            auVar61._12_4_ = (int)((ulong)lVar37 >> 0x20);
            auVar61 = auVar61 ^ auVar137;
            lVar37 = 0;
            auVar69 = _DAT_01d9fb00;
            auVar73 = _DAT_01da0bd0;
            auVar75 = _DAT_01da0bc0;
            auVar77 = _DAT_01da0bb0;
            do {
              auVar94 = auVar69 ^ auVar137;
              iVar119 = auVar61._0_4_;
              iVar118 = -(uint)(iVar119 < auVar94._0_4_);
              iVar63 = auVar61._4_4_;
              auVar96._4_4_ = -(uint)(iVar63 < auVar94._4_4_);
              iVar127 = auVar61._8_4_;
              iVar126 = -(uint)(iVar127 < auVar94._8_4_);
              iVar64 = auVar61._12_4_;
              auVar96._12_4_ = -(uint)(iVar64 < auVar94._12_4_);
              auVar113._4_4_ = iVar118;
              auVar113._0_4_ = iVar118;
              auVar113._8_4_ = iVar126;
              auVar113._12_4_ = iVar126;
              auVar132 = pshuflw(in_XMM8,auVar113,0xe8);
              auVar95._4_4_ = -(uint)(auVar94._4_4_ == iVar63);
              auVar95._12_4_ = -(uint)(auVar94._12_4_ == iVar64);
              auVar95._0_4_ = auVar95._4_4_;
              auVar95._8_4_ = auVar95._12_4_;
              auVar136 = pshuflw(in_XMM9,auVar95,0xe8);
              auVar96._0_4_ = auVar96._4_4_;
              auVar96._8_4_ = auVar96._12_4_;
              auVar94 = pshuflw(auVar132,auVar96,0xe8);
              auVar133._8_4_ = 0xffffffff;
              auVar133._0_8_ = 0xffffffffffffffff;
              auVar133._12_4_ = 0xffffffff;
              auVar133 = (auVar94 | auVar136 & auVar132) ^ auVar133;
              auVar94 = packssdw(auVar133,auVar133);
              if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar28 + lVar37) = 0x100;
              }
              auVar96 = auVar95 & auVar113 | auVar96;
              auVar94 = packssdw(auVar96,auVar96);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar94 = packssdw(auVar94 ^ auVar5,auVar94 ^ auVar5);
              if ((auVar94._0_4_ >> 0x10 & 1) != 0) {
                *(undefined2 *)((long)pvVar28 + lVar37 + 2) = 0x100;
              }
              auVar94 = auVar73 ^ auVar137;
              iVar118 = -(uint)(iVar119 < auVar94._0_4_);
              auVar124._4_4_ = -(uint)(iVar63 < auVar94._4_4_);
              iVar126 = -(uint)(iVar127 < auVar94._8_4_);
              auVar124._12_4_ = -(uint)(iVar64 < auVar94._12_4_);
              auVar97._4_4_ = iVar118;
              auVar97._0_4_ = iVar118;
              auVar97._8_4_ = iVar126;
              auVar97._12_4_ = iVar126;
              auVar114._4_4_ = -(uint)(auVar94._4_4_ == iVar63);
              auVar114._12_4_ = -(uint)(auVar94._12_4_ == iVar64);
              auVar114._0_4_ = auVar114._4_4_;
              auVar114._8_4_ = auVar114._12_4_;
              auVar124._0_4_ = auVar124._4_4_;
              auVar124._8_4_ = auVar124._12_4_;
              auVar94 = auVar114 & auVar97 | auVar124;
              auVar94 = packssdw(auVar94,auVar94);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              auVar94 = packssdw(auVar94 ^ auVar6,auVar94 ^ auVar6);
              if ((auVar94 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar28 + lVar37 + 4) = 0x100;
              }
              auVar98 = pshufhw(auVar97,auVar97,0x84);
              auVar115 = pshufhw(auVar114,auVar114,0x84);
              auVar99 = pshufhw(auVar98,auVar124,0x84);
              auVar100._8_4_ = 0xffffffff;
              auVar100._0_8_ = 0xffffffffffffffff;
              auVar100._12_4_ = 0xffffffff;
              auVar100 = (auVar99 | auVar115 & auVar98) ^ auVar100;
              auVar98 = packssdw(auVar100,auVar100);
              if ((auVar98 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar28 + lVar37 + 6) = 0x100;
              }
              auVar98 = auVar75 ^ auVar137;
              iVar118 = -(uint)(iVar119 < auVar98._0_4_);
              auVar102._4_4_ = -(uint)(iVar63 < auVar98._4_4_);
              iVar126 = -(uint)(iVar127 < auVar98._8_4_);
              auVar102._12_4_ = -(uint)(iVar64 < auVar98._12_4_);
              auVar116._4_4_ = iVar118;
              auVar116._0_4_ = iVar118;
              auVar116._8_4_ = iVar126;
              auVar116._12_4_ = iVar126;
              auVar94 = pshuflw(auVar94,auVar116,0xe8);
              auVar101._4_4_ = -(uint)(auVar98._4_4_ == iVar63);
              auVar101._12_4_ = -(uint)(auVar98._12_4_ == iVar64);
              auVar101._0_4_ = auVar101._4_4_;
              auVar101._8_4_ = auVar101._12_4_;
              in_XMM9 = pshuflw(auVar136 & auVar132,auVar101,0xe8);
              in_XMM9 = in_XMM9 & auVar94;
              auVar102._0_4_ = auVar102._4_4_;
              auVar102._8_4_ = auVar102._12_4_;
              auVar94 = pshuflw(auVar94,auVar102,0xe8);
              auVar134._8_4_ = 0xffffffff;
              auVar134._0_8_ = 0xffffffffffffffff;
              auVar134._12_4_ = 0xffffffff;
              auVar134 = (auVar94 | in_XMM9) ^ auVar134;
              auVar94 = packssdw(auVar134,auVar134);
              if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar28 + lVar37 + 8) = 0x100;
              }
              auVar102 = auVar101 & auVar116 | auVar102;
              auVar94 = packssdw(auVar102,auVar102);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar94 = packssdw(auVar94 ^ auVar7,auVar94 ^ auVar7);
              if ((auVar94 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar28 + lVar37 + 10) = 0x100;
              }
              auVar94 = auVar77 ^ auVar137;
              iVar119 = -(uint)(iVar119 < auVar94._0_4_);
              auVar125._4_4_ = -(uint)(iVar63 < auVar94._4_4_);
              iVar127 = -(uint)(iVar127 < auVar94._8_4_);
              auVar125._12_4_ = -(uint)(iVar64 < auVar94._12_4_);
              auVar103._4_4_ = iVar119;
              auVar103._0_4_ = iVar119;
              auVar103._8_4_ = iVar127;
              auVar103._12_4_ = iVar127;
              auVar117._4_4_ = -(uint)(auVar94._4_4_ == iVar63);
              auVar117._12_4_ = -(uint)(auVar94._12_4_ == iVar64);
              auVar117._0_4_ = auVar117._4_4_;
              auVar117._8_4_ = auVar117._12_4_;
              auVar125._0_4_ = auVar125._4_4_;
              auVar125._8_4_ = auVar125._12_4_;
              auVar94 = auVar117 & auVar103 | auVar125;
              auVar94 = packssdw(auVar94,auVar94);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar94 ^ auVar8,auVar94 ^ auVar8);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar28 + lVar37 + 0xc) = 0x100;
              }
              auVar94 = pshufhw(auVar103,auVar103,0x84);
              auVar136 = pshufhw(auVar117,auVar117,0x84);
              auVar132 = pshufhw(auVar94,auVar125,0x84);
              auVar104._8_4_ = 0xffffffff;
              auVar104._0_8_ = 0xffffffffffffffff;
              auVar104._12_4_ = 0xffffffff;
              auVar104 = (auVar132 | auVar136 & auVar94) ^ auVar104;
              auVar94 = packssdw(auVar104,auVar104);
              if ((auVar94 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *(undefined2 *)((long)pvVar28 + lVar37 + 0xe) = 0x100;
              }
              lVar48 = auVar69._8_8_;
              auVar69._0_8_ = auVar69._0_8_ + 8;
              auVar69._8_8_ = lVar48 + 8;
              lVar48 = auVar73._8_8_;
              auVar73._0_8_ = auVar73._0_8_ + 8;
              auVar73._8_8_ = lVar48 + 8;
              lVar48 = auVar75._8_8_;
              auVar75._0_8_ = auVar75._0_8_ + 8;
              auVar75._8_8_ = lVar48 + 8;
              lVar48 = auVar77._8_8_;
              auVar77._0_8_ = auVar77._0_8_ + 8;
              auVar77._8_8_ = lVar48 + 8;
              lVar37 = lVar37 + 0x10;
            } while (uVar41 * 0x10 != lVar37);
          }
          uVar55 = 0;
          uVar15 = 0;
          do {
            if (*(short *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar54 + uVar55) * 2) == 0x100) {
              *(ushort *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar54 + uVar55) * 2) = uVar15;
              uVar15 = uVar15 + 1;
            }
            uVar55 = uVar55 + 1;
          } while (uVar35 != uVar55);
          uVar55 = 0;
          do {
            *(undefined1 *)((long)pvVar54 + uVar55) =
                 *(undefined1 *)((long)pvVar28 + (ulong)*(byte *)((long)pvVar54 + uVar55) * 2);
            uVar55 = uVar55 + 1;
          } while (uVar35 != uVar55);
          uVar55 = (ulong)uVar15;
          if (uVar15 != 0) {
            lVar37 = 0;
            do {
              switchD_012e5a64::default((void *)((long)pvVar23 + lVar37),0,0x888);
              *(undefined8 *)((long)pvVar23 + lVar37 + 0x888) = 0x7ff0000000000000;
              lVar37 = lVar37 + 0x890;
            } while (uVar55 * 0x890 - lVar37 != 0);
          }
          uVar41 = 0;
          do {
            lVar37 = (ulong)*(byte *)((long)pvVar54 + uVar41) * 0x890;
            piVar1 = (int *)((long)pvVar23 +
                            (ulong)*(ushort *)((long)pvVar20 + uVar41 * 2) * 4 + lVar37);
            *piVar1 = *piVar1 + 1;
            plVar2 = (long *)((long)pvVar23 + lVar37 + 0x880);
            *plVar2 = *plVar2 + 1;
            uVar41 = uVar41 + 1;
          } while (uVar35 != uVar41);
          lVar56 = lVar56 + 1;
        } while (lVar56 != lVar53);
        BrotliFree(m,pvVar26);
        BrotliFree(m,pvVar27);
        BrotliFree(m,local_c8);
        BrotliFree(m,pvVar28);
        BrotliFree(m,pvVar23);
        if (uVar24 == 0) {
          lVar53 = 0x100;
          local_58 = (uint32_t *)0x0;
LAB_01d47bbe:
          local_d0 = (uint32_t *)BrotliAllocate(m,lVar53 * 4);
          uVar55 = uVar24 * 0x10 + 0x3f0;
          local_c0 = (void *)(uVar55 >> 6);
          if (0x3f < uVar55) goto LAB_01d47c09;
          local_b0 = (HistogramDistance *)0x0;
          local_90 = (HistogramLiteral *)0x0;
        }
        else {
          local_58 = (uint32_t *)BrotliAllocate(m,uVar24 * 4);
          lVar53 = uVar24 + 0x100;
          if (lVar53 != 0) goto LAB_01d47bbe;
          local_c0 = (void *)0x3ffffffffffffcf;
          lVar53 = 0;
          local_d0 = (uint32_t *)0x0;
LAB_01d47c09:
          local_b0 = (HistogramDistance *)BrotliAllocate(m,(long)local_c0 * 0x890);
          local_90 = (HistogramLiteral *)BrotliAllocate(m,(long)local_c0 * 4);
        }
        if (uVar24 == 0) {
          local_f8 = (HistogramCommand *)0x0;
        }
        else {
          uVar55 = 0x40;
          if (uVar24 < 0x40) {
            uVar55 = uVar24;
          }
          local_f8 = (HistogramCommand *)BrotliAllocate(m,uVar55 * 0x890);
        }
        local_b8 = (HistogramPair *)BrotliAllocate(m,0xc018);
        tmp_01 = (HistogramDistance *)BrotliAllocate(m,0x1120);
        lVar56 = 0;
        switchD_012e5a64::default(local_d0,0,lVar53 << 2);
        uVar55 = 0;
        do {
          local_d0[lVar56 + 0x100] = local_d0[lVar56 + 0x100] + 1;
          if ((uVar35 - 1 == uVar55) ||
             (*(char *)((long)pvVar54 + uVar55) != *(char *)((long)pvVar54 + uVar55 + 1))) {
            lVar56 = lVar56 + 1;
          }
          uVar55 = uVar55 + 1;
        } while (uVar35 != uVar55);
        if (uVar24 == 0) {
          local_118 = 0;
        }
        else {
          local_c8 = (void *)0x0;
          local_a8 = 0;
          local_118 = 0;
          lVar53 = 0;
          uVar55 = 0;
          pvVar23 = local_c0;
          uVar35 = uVar24;
          puVar18 = local_58;
          do {
            uVar41 = 0x40;
            if (uVar35 < 0x40) {
              uVar41 = uVar35;
            }
            lVar56 = uVar41 + (uVar41 == 0);
            lVar37 = 0;
            do {
              uVar46 = (ulong)local_d0[uVar55 + lVar37 + 0x100];
              pHVar29 = (HistogramDistance *)((long)local_f8 + lVar37 * 0x890);
              switchD_012e5a64::default(pHVar29,0,0x888);
              ((HistogramDistance *)((long)local_f8 + lVar37 * 0x890))->bit_cost_ = INFINITY;
              uVar41 = uVar46;
              if (uVar46 != 0) {
                do {
                  lVar48 = lVar53 * 2;
                  lVar53 = lVar53 + 1;
                  pHVar29->data_[*(ushort *)((long)pvVar20 + lVar48)] =
                       pHVar29->data_[*(ushort *)((long)pvVar20 + lVar48)] + 1;
                  uVar41 = uVar41 - 1;
                } while (uVar41 != 0);
                pHVar29->total_count_ = uVar46;
              }
              dVar57 = BrotliPopulationCostDistance(pHVar29);
              pHVar29->bit_cost_ = dVar57;
              local_d0[lVar37 + 0x40] = (uint32_t)lVar37;
              local_d0[lVar37 + 0x80] = (uint32_t)lVar37;
              local_d0[lVar37] = 1;
              lVar37 = lVar37 + 1;
            } while (lVar37 != lVar56);
            sVar39 = uVar24 - uVar55;
            if (0x3f < sVar39) {
              sVar39 = 0x40;
            }
            sVar39 = BrotliHistogramCombineDistance
                               ((HistogramDistance *)local_f8,tmp_01,local_d0,local_d0 + 0x80,
                                local_d0 + 0x40,local_b8,sVar39,sVar39,0x40,0x800);
            uVar41 = (long)local_c8 + sVar39;
            if (local_c0 < uVar41) {
              pvVar26 = local_c0;
              if (local_c0 == (void *)0x0) {
                pvVar26 = (void *)uVar41;
              }
              do {
                uVar46 = (ulong)pvVar26;
                pvVar26 = (void *)(uVar46 * 2);
              } while (uVar46 < uVar41);
              pHVar29 = (HistogramDistance *)BrotliAllocate(m,uVar46 * 0x890);
              if (local_c0 != (void *)0x0) {
                switchD_012bc561::default(pHVar29,local_b0,(long)local_c0 * 0x890);
              }
              BrotliFree(m,local_b0);
              local_c0 = (void *)uVar46;
              local_b0 = pHVar29;
            }
            uVar41 = local_a8 + sVar39;
            if (pvVar23 < uVar41) {
              uVar46 = (ulong)pvVar23;
              if (pvVar23 == (void *)0x0) {
                uVar46 = uVar41;
              }
              do {
                uVar33 = uVar46;
                uVar46 = uVar33 * 2;
              } while (uVar33 < uVar41);
              puVar30 = (uint32_t *)BrotliAllocate(m,uVar33 * 4);
              if (pvVar23 != (void *)0x0) {
                switchD_012bc561::default(puVar30,local_90,(long)pvVar23 << 2);
              }
              BrotliFree(m,local_90);
              pvVar23 = (void *)uVar33;
              local_90 = (HistogramLiteral *)puVar30;
            }
            if (sVar39 != 0) {
              pHVar29 = local_b0 + (long)local_c8;
              sVar40 = 0;
              do {
                switchD_012bc561::default
                          (pHVar29,(HistogramDistance *)
                                   ((long)local_f8 + (ulong)local_d0[sVar40 + 0x40] * 0x890),0x890);
                *(uint32_t *)((long)local_90 + (local_a8 + sVar40) * 4) =
                     local_d0[local_d0[sVar40 + 0x40]];
                local_d0[(ulong)local_d0[sVar40 + 0x40] + 0xc0] = (uint32_t)sVar40;
                sVar40 = sVar40 + 1;
                pHVar29 = pHVar29 + 1;
              } while (sVar39 != sVar40);
              local_c8 = (void *)((long)local_c8 + sVar40);
              local_a8 = local_a8 + sVar40;
            }
            lVar37 = 0;
            do {
              puVar18[lVar37] = local_d0[(ulong)local_d0[lVar37 + 0x80] + 0xc0] + (int)local_118;
              lVar37 = lVar37 + 1;
            } while (lVar56 != lVar37);
            local_118 = local_118 + sVar39;
            uVar55 = uVar55 + 0x40;
            uVar35 = uVar35 - 0x40;
            puVar18 = puVar18 + 0x40;
          } while (uVar55 < uVar24);
        }
        BrotliFree(m,local_f8);
        uVar35 = (local_118 >> 1) * local_118;
        if (local_118 << 6 < uVar35) {
          uVar35 = local_118 << 6;
        }
        if (0x800 < uVar35) {
          BrotliFree(m,local_b8);
          local_b8 = (HistogramPair *)BrotliAllocate(m,uVar35 * 0x18 + 0x18);
        }
        if (local_118 == 0) {
          puVar18 = (uint32_t *)0x0;
        }
        else {
          puVar18 = (uint32_t *)BrotliAllocate(m,local_118 * 4);
          auVar137 = _DAT_01d9fb10;
          lVar53 = local_118 - 1;
          auVar62._8_4_ = (int)lVar53;
          auVar62._0_8_ = lVar53;
          auVar62._12_4_ = (int)((ulong)lVar53 >> 0x20);
          uVar55 = 0;
          auVar62 = auVar62 ^ _DAT_01d9fb10;
          auVar70 = _DAT_01d9fb00;
          do {
            auVar94 = auVar70 ^ auVar137;
            if ((bool)(~(auVar94._4_4_ == auVar62._4_4_ && auVar62._0_4_ < auVar94._0_4_ ||
                        auVar62._4_4_ < auVar94._4_4_) & 1)) {
              puVar18[uVar55] = (uint32_t)uVar55;
            }
            if ((auVar94._12_4_ != auVar62._12_4_ || auVar94._8_4_ <= auVar62._8_4_) &&
                auVar94._12_4_ <= auVar62._12_4_) {
              puVar18[uVar55 + 1] = (uint32_t)uVar55 + 1;
            }
            uVar55 = uVar55 + 2;
            lVar53 = auVar70._8_8_;
            auVar70._0_8_ = auVar70._0_8_ + 2;
            auVar70._8_8_ = lVar53 + 2;
          } while ((local_118 + 1 & 0xfffffffffffffffe) != uVar55);
        }
        sVar39 = BrotliHistogramCombineDistance
                           (local_b0,tmp_01,local_90->data_,local_58,puVar18,local_b8,local_118,
                            uVar24,0x100,uVar35);
        BrotliFree(m,local_b8);
        BrotliFree(m,local_90);
        if (local_118 == 0) {
          local_e8 = (void *)0x0;
        }
        else {
          local_e8 = BrotliAllocate(m,local_118 << 2);
          switchD_012e5a64::default(local_e8,0xff,local_118 << 2);
        }
        if (uVar24 != 0) {
          iVar119 = 0;
          local_e0 = (void *)0x0;
          uVar35 = 0;
          do {
            switchD_012e5a64::default(tmp_01,0,0x888);
            tmp_01->bit_cost_ = INFINITY;
            if (local_d0[uVar35 + 0x100] != 0) {
              uVar55 = 0;
              do {
                tmp_01->data_[*(ushort *)((long)pvVar20 + uVar55 * 2 + (long)local_e0 * 2)] =
                     tmp_01->data_[*(ushort *)((long)pvVar20 + uVar55 * 2 + (long)local_e0 * 2)] + 1
                ;
                uVar55 = uVar55 + 1;
              } while (uVar55 < local_d0[uVar35 + 0x100]);
              tmp_01->total_count_ = uVar55;
              local_e0 = (void *)((long)local_e0 + uVar55);
            }
            lVar53 = 0;
            if (uVar35 != 0) {
              lVar53 = uVar35 - 1;
            }
            uVar55 = (ulong)local_58[lVar53];
            local_f8 = (HistogramCommand *)
                       BrotliHistogramBitCostDistanceDistance(tmp_01,local_b0 + uVar55,tmp_01 + 1);
            if (sVar39 != 0) {
              sVar40 = 0;
              do {
                dVar57 = BrotliHistogramBitCostDistanceDistance
                                   (tmp_01,local_b0 + puVar18[sVar40],tmp_01 + 1);
                if (dVar57 < (double)local_f8) {
                  uVar55 = (ulong)puVar18[sVar40];
                  local_f8 = (HistogramCommand *)dVar57;
                }
                sVar40 = sVar40 + 1;
              } while (sVar39 != sVar40);
            }
            local_58[uVar35] = (uint32_t)uVar55;
            if (*(int *)((long)local_e8 + uVar55 * 4) == -1) {
              *(int *)((long)local_e8 + uVar55 * 4) = iVar119;
              iVar119 = iVar119 + 1;
            }
            uVar35 = uVar35 + 1;
          } while (uVar35 != uVar24);
        }
        BrotliFree(m,tmp_01);
        BrotliFree(m,puVar18);
        BrotliFree(m,local_b0);
        uVar35 = dist_split->types_alloc_size;
        if (uVar35 < uVar24) {
          if (uVar35 == 0) {
            uVar35 = uVar24;
          }
          do {
            uVar55 = uVar35;
            uVar35 = uVar55 * 2;
          } while (uVar55 < uVar24);
          puVar17 = (uint8_t *)BrotliAllocate(m,uVar55);
          if (dist_split->types_alloc_size != 0) {
            switchD_012bc561::default(puVar17,dist_split->types,dist_split->types_alloc_size);
          }
          BrotliFree(m,dist_split->types);
          dist_split->types = puVar17;
          dist_split->types_alloc_size = uVar55;
        }
        uVar35 = dist_split->lengths_alloc_size;
        if (uVar35 < uVar24) {
          if (uVar35 == 0) {
            uVar35 = uVar24;
          }
          do {
            uVar55 = uVar35;
            uVar35 = uVar55 * 2;
          } while (uVar55 < uVar24);
          puVar18 = (uint32_t *)BrotliAllocate(m,uVar55 * 4);
          if (dist_split->lengths_alloc_size != 0) {
            switchD_012bc561::default
                      (puVar18,dist_split->lengths,dist_split->lengths_alloc_size << 2);
          }
          BrotliFree(m,dist_split->lengths);
          dist_split->lengths = puVar18;
          dist_split->lengths_alloc_size = uVar55;
LAB_01d48519:
          uVar43 = 0;
          sVar39 = 0;
          uVar38 = 0;
          uVar35 = 0;
          do {
            uVar38 = uVar38 + local_d0[uVar35 + 0x100];
            if ((uVar24 - 1 == uVar35) || (local_58[uVar35] != local_58[uVar35 + 1])) {
              uVar44 = uVar43 & 0xff;
              uVar3 = *(uint *)((long)local_e8 + (ulong)local_58[uVar35] * 4);
              bVar45 = (byte)uVar3;
              dist_split->types[sVar39] = bVar45;
              bVar42 = (byte)uVar43;
              uVar43 = uVar3;
              if (bVar45 < bVar42) {
                uVar43 = uVar44;
              }
              dist_split->lengths[sVar39] = uVar38;
              sVar39 = sVar39 + 1;
              uVar38 = 0;
            }
            uVar35 = uVar35 + 1;
          } while (uVar24 != uVar35);
          sVar40 = (ulong)(uVar43 & 0xff) + 1;
        }
        else {
          if (uVar24 != 0) goto LAB_01d48519;
          sVar40 = 1;
          sVar39 = 0;
        }
        dist_split->num_blocks = sVar39;
        dist_split->num_types = sVar40;
        BrotliFree(m,local_e8);
        BrotliFree(m,local_d0);
        BrotliFree(m,local_58);
        BrotliFree(m,pvVar54);
        goto LAB_01d4721f;
      }
    }
  }
  dist_split->num_types = 1;
LAB_01d4721f:
  BrotliFree(m,pvVar20);
  return;
}

Assistant:

void duckdb_brotli::BrotliSplitBlock(MemoryManager* m,
                      const Command* cmds,
                      const size_t num_commands,
                      const uint8_t* data,
                      const size_t pos,
                      const size_t mask,
                      const BrotliEncoderParams* params,
                      BlockSplit* literal_split,
                      BlockSplit* insert_and_copy_split,
                      BlockSplit* dist_split) {
  {
    size_t literals_count = CountLiterals(cmds, num_commands);
    uint8_t* literals = BROTLI_ALLOC(m, uint8_t, literals_count);
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(literals)) return;
    /* Create a continuous array of literals. */
    CopyLiteralsToByteArray(cmds, num_commands, data, pos, mask, literals);
    /* Create the block split on the array of literals.
     * Literal histograms can have alphabet size up to 256.
     * Though, to accomodate context modeling, less than half of maximum size
     * is allowed. */
    SplitByteVectorLiteral(
        m, literals, literals_count,
        kSymbolsPerLiteralHistogram, kMaxLiteralHistograms,
        kLiteralStrideLength, kLiteralBlockSwitchCost, params,
        literal_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, literals);
    /* NB: this might be a good place for injecting extra splitting without
     *     increasing encoder complexity; however, output parition would be less
     *     optimal than one produced with forced splitting inside
     *     SplitByteVector (FindBlocks / ClusterBlocks). */
  }

  {
    /* Compute prefix codes for commands. */
    uint16_t* insert_and_copy_codes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(insert_and_copy_codes)) return;
    for (i = 0; i < num_commands; ++i) {
      insert_and_copy_codes[i] = cmds[i].cmd_prefix_;
    }
    /* Create the block split on the array of command prefixes. */
    SplitByteVectorCommand(
        m, insert_and_copy_codes, num_commands,
        kSymbolsPerCommandHistogram, kMaxCommandHistograms,
        kCommandStrideLength, kCommandBlockSwitchCost, params,
        insert_and_copy_split);
    if (BROTLI_IS_OOM(m)) return;
    /* TODO(eustas): reuse for distances? */
    BROTLI_FREE(m, insert_and_copy_codes);
  }

  {
    /* Create a continuous array of distance prefixes. */
    uint16_t* distance_prefixes = BROTLI_ALLOC(m, uint16_t, num_commands);
    size_t j = 0;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(distance_prefixes)) return;
    for (i = 0; i < num_commands; ++i) {
      const Command* cmd = &cmds[i];
      if (CommandCopyLen(cmd) && cmd->cmd_prefix_ >= 128) {
        distance_prefixes[j++] = cmd->dist_prefix_ & 0x3FF;
      }
    }
    /* Create the block split on the array of distance prefixes. */
    SplitByteVectorDistance(
        m, distance_prefixes, j,
        kSymbolsPerDistanceHistogram, kMaxCommandHistograms,
        kDistanceStrideLength, kDistanceBlockSwitchCost, params,
        dist_split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, distance_prefixes);
  }
}